

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  bool bVar68;
  undefined1 auVar69 [12];
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  uint uVar88;
  ulong uVar89;
  uint uVar90;
  ulong uVar91;
  long lVar92;
  ulong uVar93;
  bool bVar94;
  float fVar95;
  float fVar120;
  float fVar121;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar122;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar123;
  float fVar153;
  float fVar155;
  vint4 bi_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar139 [32];
  float fVar154;
  float fVar156;
  float fVar158;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar133 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar138 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vint4 ai;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [28];
  float fVar198;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar214;
  float fVar215;
  vint4 bi;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar216;
  float fVar219;
  undefined1 auVar209 [28];
  float fVar217;
  float fVar218;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar213 [32];
  float fVar220;
  float fVar235;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar221 [16];
  float fVar237;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar238;
  float fVar239;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar253;
  undefined1 auVar243 [16];
  float fVar251;
  float fVar254;
  float fVar257;
  undefined1 auVar246 [32];
  float fVar252;
  float fVar255;
  float fVar258;
  float fVar260;
  float fVar262;
  float fVar264;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar256;
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar249 [64];
  float fVar265;
  float fVar275;
  float fVar276;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar278;
  float fVar280;
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar269 [32];
  float fVar277;
  float fVar279;
  float fVar281;
  float fVar283;
  float fVar285;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar297;
  float fVar300;
  vint4 ai_1;
  undefined1 auVar290 [16];
  float fVar298;
  float fVar299;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar306;
  float fVar309;
  float fVar312;
  undefined1 auVar296 [64];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar324;
  float fVar328;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [28];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar323 [32];
  float s;
  undefined1 auVar352 [16];
  float fVar355;
  undefined1 auVar353 [32];
  float t;
  undefined1 auVar356 [16];
  float fVar359;
  undefined1 auVar357 [32];
  float fVar360;
  float fVar361;
  float fVar366;
  float fVar368;
  undefined1 auVar362 [16];
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar373;
  float fVar375;
  float fVar377;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar372;
  float fVar374;
  float fVar376;
  undefined1 auVar365 [64];
  float fVar378;
  float fVar379;
  float fVar387;
  float fVar389;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  float fVar390;
  undefined1 auVar383 [32];
  float fVar388;
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar386 [64];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  float fVar396;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  undefined1 auVar397 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_ba0;
  undefined8 local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [8];
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined8 *local_988;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar354 [64];
  undefined1 auVar358 [64];
  
  PVar2 = prim[1];
  uVar91 = (ulong)(byte)PVar2;
  auVar126 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar185 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar185 = vinsertps_avx(auVar185,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar220 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar126 = vsubps_avx(auVar126,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  auVar162._0_4_ = fVar220 * auVar126._0_4_;
  auVar162._4_4_ = fVar220 * auVar126._4_4_;
  auVar162._8_4_ = fVar220 * auVar126._8_4_;
  auVar162._12_4_ = fVar220 * auVar126._12_4_;
  auVar266._0_4_ = fVar220 * auVar185._0_4_;
  auVar266._4_4_ = fVar220 * auVar185._4_4_;
  auVar266._8_4_ = fVar220 * auVar185._8_4_;
  auVar266._12_4_ = fVar220 * auVar185._12_4_;
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar185 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar185 = vcvtdq2ps_avx(auVar185);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar91 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar93 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar91 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar93 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar96 = vshufps_avx(auVar266,auVar266,0);
  auVar124 = vshufps_avx(auVar266,auVar266,0x55);
  auVar163 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar220 = auVar163._0_4_;
  fVar182 = auVar163._4_4_;
  fVar235 = auVar163._8_4_;
  fVar196 = auVar163._12_4_;
  fVar240 = auVar124._0_4_;
  fVar250 = auVar124._4_4_;
  fVar253 = auVar124._8_4_;
  fVar256 = auVar124._12_4_;
  fVar236 = auVar96._0_4_;
  fVar197 = auVar96._4_4_;
  fVar237 = auVar96._8_4_;
  fVar198 = auVar96._12_4_;
  auVar362._0_4_ = fVar236 * auVar126._0_4_ + fVar240 * auVar185._0_4_ + fVar220 * auVar101._0_4_;
  auVar362._4_4_ = fVar197 * auVar126._4_4_ + fVar250 * auVar185._4_4_ + fVar182 * auVar101._4_4_;
  auVar362._8_4_ = fVar237 * auVar126._8_4_ + fVar253 * auVar185._8_4_ + fVar235 * auVar101._8_4_;
  auVar362._12_4_ =
       fVar198 * auVar126._12_4_ + fVar256 * auVar185._12_4_ + fVar196 * auVar101._12_4_;
  auVar380._0_4_ = fVar236 * auVar127._0_4_ + fVar240 * auVar128._0_4_ + auVar15._0_4_ * fVar220;
  auVar380._4_4_ = fVar197 * auVar127._4_4_ + fVar250 * auVar128._4_4_ + auVar15._4_4_ * fVar182;
  auVar380._8_4_ = fVar237 * auVar127._8_4_ + fVar253 * auVar128._8_4_ + auVar15._8_4_ * fVar235;
  auVar380._12_4_ = fVar198 * auVar127._12_4_ + fVar256 * auVar128._12_4_ + auVar15._12_4_ * fVar196
  ;
  auVar267._0_4_ = fVar236 * auVar97._0_4_ + fVar240 * auVar98._0_4_ + auVar125._0_4_ * fVar220;
  auVar267._4_4_ = fVar197 * auVar97._4_4_ + fVar250 * auVar98._4_4_ + auVar125._4_4_ * fVar182;
  auVar267._8_4_ = fVar237 * auVar97._8_4_ + fVar253 * auVar98._8_4_ + auVar125._8_4_ * fVar235;
  auVar267._12_4_ = fVar198 * auVar97._12_4_ + fVar256 * auVar98._12_4_ + auVar125._12_4_ * fVar196;
  auVar96 = vshufps_avx(auVar162,auVar162,0);
  auVar124 = vshufps_avx(auVar162,auVar162,0x55);
  auVar163 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar220 = auVar163._0_4_;
  fVar182 = auVar163._4_4_;
  fVar235 = auVar163._8_4_;
  fVar196 = auVar163._12_4_;
  fVar240 = auVar124._0_4_;
  fVar250 = auVar124._4_4_;
  fVar253 = auVar124._8_4_;
  fVar256 = auVar124._12_4_;
  fVar236 = auVar96._0_4_;
  fVar197 = auVar96._4_4_;
  fVar237 = auVar96._8_4_;
  fVar198 = auVar96._12_4_;
  auVar199._0_4_ = fVar236 * auVar126._0_4_ + fVar240 * auVar185._0_4_ + fVar220 * auVar101._0_4_;
  auVar199._4_4_ = fVar197 * auVar126._4_4_ + fVar250 * auVar185._4_4_ + fVar182 * auVar101._4_4_;
  auVar199._8_4_ = fVar237 * auVar126._8_4_ + fVar253 * auVar185._8_4_ + fVar235 * auVar101._8_4_;
  auVar199._12_4_ =
       fVar198 * auVar126._12_4_ + fVar256 * auVar185._12_4_ + fVar196 * auVar101._12_4_;
  auVar124._0_4_ = fVar236 * auVar127._0_4_ + auVar15._0_4_ * fVar220 + fVar240 * auVar128._0_4_;
  auVar124._4_4_ = fVar197 * auVar127._4_4_ + auVar15._4_4_ * fVar182 + fVar250 * auVar128._4_4_;
  auVar124._8_4_ = fVar237 * auVar127._8_4_ + auVar15._8_4_ * fVar235 + fVar253 * auVar128._8_4_;
  auVar124._12_4_ = fVar198 * auVar127._12_4_ + auVar15._12_4_ * fVar196 + fVar256 * auVar128._12_4_
  ;
  auVar96._0_4_ = fVar236 * auVar97._0_4_ + fVar240 * auVar98._0_4_ + auVar125._0_4_ * fVar220;
  auVar96._4_4_ = fVar197 * auVar97._4_4_ + fVar250 * auVar98._4_4_ + auVar125._4_4_ * fVar182;
  auVar96._8_4_ = fVar237 * auVar97._8_4_ + fVar253 * auVar98._8_4_ + auVar125._8_4_ * fVar235;
  auVar96._12_4_ = fVar198 * auVar97._12_4_ + fVar256 * auVar98._12_4_ + auVar125._12_4_ * fVar196;
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar126 = vandps_avx(auVar362,auVar243);
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  auVar126 = vcmpps_avx(auVar126,auVar183,1);
  auVar185 = vblendvps_avx(auVar362,auVar183,auVar126);
  auVar126 = vandps_avx(auVar380,auVar243);
  auVar126 = vcmpps_avx(auVar126,auVar183,1);
  auVar101 = vblendvps_avx(auVar380,auVar183,auVar126);
  auVar126 = vandps_avx(auVar267,auVar243);
  auVar126 = vcmpps_avx(auVar126,auVar183,1);
  auVar126 = vblendvps_avx(auVar267,auVar183,auVar126);
  auVar127 = vrcpps_avx(auVar185);
  fVar240 = auVar127._0_4_;
  auVar163._0_4_ = fVar240 * auVar185._0_4_;
  fVar250 = auVar127._4_4_;
  auVar163._4_4_ = fVar250 * auVar185._4_4_;
  fVar253 = auVar127._8_4_;
  auVar163._8_4_ = fVar253 * auVar185._8_4_;
  fVar256 = auVar127._12_4_;
  auVar163._12_4_ = fVar256 * auVar185._12_4_;
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar185 = vsubps_avx(auVar268,auVar163);
  fVar240 = fVar240 + fVar240 * auVar185._0_4_;
  fVar250 = fVar250 + fVar250 * auVar185._4_4_;
  fVar253 = fVar253 + fVar253 * auVar185._8_4_;
  fVar256 = fVar256 + fVar256 * auVar185._12_4_;
  auVar185 = vrcpps_avx(auVar101);
  fVar220 = auVar185._0_4_;
  auVar221._0_4_ = fVar220 * auVar101._0_4_;
  fVar235 = auVar185._4_4_;
  auVar221._4_4_ = fVar235 * auVar101._4_4_;
  fVar236 = auVar185._8_4_;
  auVar221._8_4_ = fVar236 * auVar101._8_4_;
  fVar237 = auVar185._12_4_;
  auVar221._12_4_ = fVar237 * auVar101._12_4_;
  auVar185 = vsubps_avx(auVar268,auVar221);
  fVar220 = fVar220 + fVar220 * auVar185._0_4_;
  fVar235 = fVar235 + fVar235 * auVar185._4_4_;
  fVar236 = fVar236 + fVar236 * auVar185._8_4_;
  fVar237 = fVar237 + fVar237 * auVar185._12_4_;
  auVar185 = vrcpps_avx(auVar126);
  fVar182 = auVar185._0_4_;
  auVar184._0_4_ = fVar182 * auVar126._0_4_;
  fVar196 = auVar185._4_4_;
  auVar184._4_4_ = fVar196 * auVar126._4_4_;
  fVar197 = auVar185._8_4_;
  auVar184._8_4_ = fVar197 * auVar126._8_4_;
  fVar198 = auVar185._12_4_;
  auVar184._12_4_ = fVar198 * auVar126._12_4_;
  auVar126 = vsubps_avx(auVar268,auVar184);
  fVar182 = fVar182 + fVar182 * auVar126._0_4_;
  fVar196 = fVar196 + fVar196 * auVar126._4_4_;
  fVar197 = fVar197 + fVar197 * auVar126._8_4_;
  fVar198 = fVar198 + fVar198 * auVar126._12_4_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar126 = vpmovsxwd_avx(auVar126);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar199);
  auVar164._0_4_ = fVar240 * auVar126._0_4_;
  auVar164._4_4_ = fVar250 * auVar126._4_4_;
  auVar164._8_4_ = fVar253 * auVar126._8_4_;
  auVar164._12_4_ = fVar256 * auVar126._12_4_;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar126 = vpmovsxwd_avx(auVar185);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar199);
  auVar200._0_4_ = fVar240 * auVar126._0_4_;
  auVar200._4_4_ = fVar250 * auVar126._4_4_;
  auVar200._8_4_ = fVar253 * auVar126._8_4_;
  auVar200._12_4_ = fVar256 * auVar126._12_4_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar185 = vpmovsxwd_avx(auVar101);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar91 * -2 + 6);
  auVar126 = vpmovsxwd_avx(auVar127);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar124);
  auVar290._0_4_ = auVar126._0_4_ * fVar220;
  auVar290._4_4_ = auVar126._4_4_ * fVar235;
  auVar290._8_4_ = auVar126._8_4_ * fVar236;
  auVar290._12_4_ = auVar126._12_4_ * fVar237;
  auVar126 = vcvtdq2ps_avx(auVar185);
  auVar126 = vsubps_avx(auVar126,auVar124);
  auVar125._0_4_ = fVar220 * auVar126._0_4_;
  auVar125._4_4_ = fVar235 * auVar126._4_4_;
  auVar125._8_4_ = fVar236 * auVar126._8_4_;
  auVar125._12_4_ = fVar237 * auVar126._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar93 + uVar91 + 6);
  auVar126 = vpmovsxwd_avx(auVar128);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar96);
  auVar222._0_4_ = auVar126._0_4_ * fVar182;
  auVar222._4_4_ = auVar126._4_4_ * fVar196;
  auVar222._8_4_ = auVar126._8_4_ * fVar197;
  auVar222._12_4_ = auVar126._12_4_ * fVar198;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar126 = vpmovsxwd_avx(auVar15);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar126 = vsubps_avx(auVar126,auVar96);
  auVar97._0_4_ = auVar126._0_4_ * fVar182;
  auVar97._4_4_ = auVar126._4_4_ * fVar196;
  auVar97._8_4_ = auVar126._8_4_ * fVar197;
  auVar97._12_4_ = auVar126._12_4_ * fVar198;
  auVar126 = vpminsd_avx(auVar164,auVar200);
  auVar185 = vpminsd_avx(auVar290,auVar125);
  auVar126 = vmaxps_avx(auVar126,auVar185);
  auVar185 = vpminsd_avx(auVar222,auVar97);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar320._4_4_ = uVar1;
  auVar320._0_4_ = uVar1;
  auVar320._8_4_ = uVar1;
  auVar320._12_4_ = uVar1;
  auVar185 = vmaxps_avx(auVar185,auVar320);
  auVar126 = vmaxps_avx(auVar126,auVar185);
  local_4f0._0_4_ = auVar126._0_4_ * 0.99999964;
  local_4f0._4_4_ = auVar126._4_4_ * 0.99999964;
  local_4f0._8_4_ = auVar126._8_4_ * 0.99999964;
  local_4f0._12_4_ = auVar126._12_4_ * 0.99999964;
  auVar126 = vpmaxsd_avx(auVar164,auVar200);
  auVar185 = vpmaxsd_avx(auVar290,auVar125);
  auVar126 = vminps_avx(auVar126,auVar185);
  auVar185 = vpmaxsd_avx(auVar222,auVar97);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar165._4_4_ = uVar1;
  auVar165._0_4_ = uVar1;
  auVar165._8_4_ = uVar1;
  auVar165._12_4_ = uVar1;
  auVar185 = vminps_avx(auVar185,auVar165);
  auVar126 = vminps_avx(auVar126,auVar185);
  auVar98._0_4_ = auVar126._0_4_ * 1.0000004;
  auVar98._4_4_ = auVar126._4_4_ * 1.0000004;
  auVar98._8_4_ = auVar126._8_4_ * 1.0000004;
  auVar98._12_4_ = auVar126._12_4_ * 1.0000004;
  auVar126 = vpshufd_avx(ZEXT116((byte)PVar2),0);
  auVar185 = vpcmpgtd_avx(auVar126,_DAT_01ff0cf0);
  auVar126 = vcmpps_avx(local_4f0,auVar98,2);
  auVar126 = vandps_avx(auVar126,auVar185);
  uVar88 = vmovmskps_avx(auVar126);
  if (uVar88 == 0) {
    return;
  }
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  uVar88 = uVar88 & 0xff;
  local_4a0 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  local_988 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8b0 = prim;
LAB_00f49ff5:
  local_8a8 = (ulong)uVar88;
  lVar92 = 0;
  if (local_8a8 != 0) {
    for (; (uVar88 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  local_8a8 = local_8a8 - 1 & local_8a8;
  uVar88 = *(uint *)(local_8b0 + 2);
  uVar3 = *(uint *)(local_8b0 + lVar92 * 4 + 6);
  local_b10 = (ulong)uVar3;
  pGVar4 = (context->scene->geometries).items[uVar88].ptr;
  uVar93 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_b10);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar92 = *(long *)&pGVar4[1].time_range.upper;
  auVar126 = *(undefined1 (*) [16])(lVar92 + (long)p_Var5 * uVar93);
  auVar185 = *(undefined1 (*) [16])(lVar92 + (uVar93 + 1) * (long)p_Var5);
  lVar6 = 0;
  if (local_8a8 != 0) {
    for (; (local_8a8 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  if (((local_8a8 != 0) && (uVar91 = local_8a8 - 1 & local_8a8, uVar91 != 0)) &&
     (lVar6 = 0, uVar91 != 0)) {
    for (; (uVar91 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar127 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar220 = *(float *)(ray + k * 4 + 0x40);
  auVar321._4_4_ = fVar220;
  auVar321._0_4_ = fVar220;
  auVar321._8_4_ = fVar220;
  auVar321._12_4_ = fVar220;
  fStack_7b0 = fVar220;
  _local_7c0 = auVar321;
  fStack_7ac = fVar220;
  fStack_7a8 = fVar220;
  fStack_7a4 = fVar220;
  fVar182 = *(float *)(ray + k * 4 + 0x50);
  auVar352._4_4_ = fVar182;
  auVar352._0_4_ = fVar182;
  auVar352._8_4_ = fVar182;
  auVar352._12_4_ = fVar182;
  fStack_7d0 = fVar182;
  _local_7e0 = auVar352;
  fStack_7cc = fVar182;
  fStack_7c8 = fVar182;
  fStack_7c4 = fVar182;
  auVar354 = ZEXT3264(_local_7e0);
  auVar101 = vunpcklps_avx(auVar321,auVar352);
  fVar235 = *(float *)(ray + k * 4 + 0x60);
  auVar356._4_4_ = fVar235;
  auVar356._0_4_ = fVar235;
  auVar356._8_4_ = fVar235;
  auVar356._12_4_ = fVar235;
  fStack_7f0 = fVar235;
  _local_800 = auVar356;
  fStack_7ec = fVar235;
  fStack_7e8 = fVar235;
  fStack_7e4 = fVar235;
  auVar358 = ZEXT3264(_local_800);
  _local_8f0 = vinsertps_avx(auVar101,auVar356,0x28);
  auVar365 = ZEXT1664(_local_8f0);
  auVar99._0_4_ = (auVar126._0_4_ + auVar185._0_4_) * 0.5;
  auVar99._4_4_ = (auVar126._4_4_ + auVar185._4_4_) * 0.5;
  auVar99._8_4_ = (auVar126._8_4_ + auVar185._8_4_) * 0.5;
  auVar99._12_4_ = (auVar126._12_4_ + auVar185._12_4_) * 0.5;
  auVar101 = vsubps_avx(auVar99,auVar127);
  auVar101 = vdpps_avx(auVar101,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar386 = ZEXT1664(local_900);
  auVar128 = vrcpss_avx(local_900,local_900);
  fVar196 = auVar101._0_4_ * auVar128._0_4_ * (2.0 - local_900._0_4_ * auVar128._0_4_);
  auVar128 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
  auVar223._0_4_ = auVar127._0_4_ + local_8f0._0_4_ * auVar128._0_4_;
  auVar223._4_4_ = auVar127._4_4_ + local_8f0._4_4_ * auVar128._4_4_;
  auVar223._8_4_ = auVar127._8_4_ + local_8f0._8_4_ * auVar128._8_4_;
  auVar223._12_4_ = auVar127._12_4_ + local_8f0._12_4_ * auVar128._12_4_;
  auVar101 = vblendps_avx(auVar223,_DAT_01feba10,8);
  _local_a20 = vsubps_avx(auVar126,auVar101);
  _local_a30 = vsubps_avx(*(undefined1 (*) [16])(lVar92 + (uVar93 + 2) * (long)p_Var5),auVar101);
  _local_a40 = vsubps_avx(auVar185,auVar101);
  auVar296 = ZEXT1664(_local_a40);
  _local_a50 = vsubps_avx(*(undefined1 (*) [16])(lVar92 + (uVar93 + 3) * (long)p_Var5),auVar101);
  auVar126 = vshufps_avx(_local_a20,_local_a20,0);
  register0x00001250 = auVar126;
  _local_340 = auVar126;
  auVar126 = vshufps_avx(_local_a20,_local_a20,0x55);
  register0x00001250 = auVar126;
  _local_1a0 = auVar126;
  auVar126 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001250 = auVar126;
  _local_1c0 = auVar126;
  auVar126 = vshufps_avx(_local_a20,_local_a20,0xff);
  register0x00001290 = auVar126;
  _local_1e0 = auVar126;
  auVar126 = vshufps_avx(_local_a40,_local_a40,0);
  register0x00001290 = auVar126;
  _local_360 = auVar126;
  auVar126 = vshufps_avx(_local_a40,_local_a40,0x55);
  register0x00001290 = auVar126;
  _local_380 = auVar126;
  auVar126 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001290 = auVar126;
  _local_3a0 = auVar126;
  auVar126 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001290 = auVar126;
  _local_200 = auVar126;
  auVar126 = vshufps_avx(_local_a30,_local_a30,0);
  register0x00001290 = auVar126;
  _local_3c0 = auVar126;
  auVar126 = vshufps_avx(_local_a30,_local_a30,0x55);
  register0x00001290 = auVar126;
  _local_3e0 = auVar126;
  auVar126 = vshufps_avx(_local_a30,_local_a30,0xaa);
  register0x00001290 = auVar126;
  _local_400 = auVar126;
  auVar126 = vshufps_avx(_local_a30,_local_a30,0xff);
  register0x00001290 = auVar126;
  _local_420 = auVar126;
  auVar126 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001290 = auVar126;
  _local_440 = auVar126;
  auVar126 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001290 = auVar126;
  _local_460 = auVar126;
  auVar126 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001290 = auVar126;
  _local_480 = auVar126;
  auVar126 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001290 = auVar126;
  _local_220 = auVar126;
  auVar126 = ZEXT416((uint)(fVar220 * fVar220 + fVar182 * fVar182 + fVar235 * fVar235));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  local_240._16_16_ = auVar126;
  local_240._0_16_ = auVar126;
  fVar220 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar196);
  auVar126 = vshufps_avx(ZEXT416((uint)(fVar220 - fVar196)),ZEXT416((uint)(fVar220 - fVar196)),0);
  local_260._16_16_ = auVar126;
  local_260._0_16_ = auVar126;
  local_750 = vshufps_avx(ZEXT416(uVar88),ZEXT416(uVar88),0);
  local_760 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
  register0x000013d0 = auVar128;
  _local_980 = auVar128;
  uVar93 = 1;
  uVar91 = 0;
  auVar111._8_4_ = 0x7fffffff;
  auVar111._0_8_ = 0x7fffffff7fffffff;
  auVar111._12_4_ = 0x7fffffff;
  auVar111._16_4_ = 0x7fffffff;
  auVar111._20_4_ = 0x7fffffff;
  auVar111._24_4_ = 0x7fffffff;
  auVar111._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_240,auVar111);
  auVar126 = vsqrtss_avx(local_900,local_900);
  local_b04 = auVar126._0_4_;
  auVar126 = vsqrtss_avx(local_900,local_900);
  local_b08 = auVar126._0_4_;
  auVar249 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar210._8_4_ = 0x3f800000;
  auVar210._0_8_ = &DAT_3f8000003f800000;
  auVar210._12_4_ = 0x3f800000;
  auVar210._16_4_ = 0x3f800000;
  auVar210._20_4_ = 0x3f800000;
  auVar210._24_4_ = 0x3f800000;
  auVar210._28_4_ = 0x3f800000;
  do {
    local_a60 = auVar249._0_16_;
    auVar126 = vmovshdup_avx(local_a60);
    fVar250 = auVar126._0_4_ - auVar249._0_4_;
    auVar126 = vshufps_avx(local_a60,local_a60,0);
    local_940._16_16_ = auVar126;
    local_940._0_16_ = auVar126;
    auVar185 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
    local_960._16_16_ = auVar185;
    local_960._0_16_ = auVar185;
    fVar123 = auVar185._0_4_;
    fVar153 = auVar185._4_4_;
    fVar155 = auVar185._8_4_;
    fVar157 = auVar185._12_4_;
    fVar95 = auVar126._0_4_;
    auVar191._0_4_ = fVar95 + fVar123 * 0.0;
    fVar120 = auVar126._4_4_;
    auVar191._4_4_ = fVar120 + fVar153 * 0.14285715;
    fVar121 = auVar126._8_4_;
    auVar191._8_4_ = fVar121 + fVar155 * 0.2857143;
    fVar122 = auVar126._12_4_;
    auVar191._12_4_ = fVar122 + fVar157 * 0.42857146;
    auVar191._16_4_ = fVar95 + fVar123 * 0.5714286;
    auVar191._20_4_ = fVar120 + fVar153 * 0.71428573;
    auVar191._24_4_ = fVar121 + fVar155 * 0.8571429;
    auVar191._28_4_ = fVar122 + fVar157;
    auVar110 = vsubps_avx(auVar210,auVar191);
    local_9e0._4_4_ = auVar191._4_4_ * auVar191._4_4_;
    local_9e0._0_4_ = auVar191._0_4_ * auVar191._0_4_;
    fStack_9d8 = auVar191._8_4_ * auVar191._8_4_;
    fStack_9d4 = auVar191._12_4_ * auVar191._12_4_;
    fStack_9d0 = auVar191._16_4_ * auVar191._16_4_;
    fStack_9cc = auVar191._20_4_ * auVar191._20_4_;
    fStack_9c8 = auVar191._24_4_ * auVar191._24_4_;
    fStack_9c4 = fVar122;
    fVar256 = auVar191._0_4_ * 3.0;
    fVar214 = auVar191._4_4_ * 3.0;
    fVar215 = auVar191._8_4_ * 3.0;
    fVar216 = auVar191._12_4_ * 3.0;
    fVar217 = auVar191._16_4_ * 3.0;
    fVar218 = auVar191._20_4_ * 3.0;
    fVar219 = auVar191._24_4_ * 3.0;
    fVar235 = auVar110._0_4_;
    auVar249._0_4_ = fVar235 * fVar235;
    fVar196 = auVar110._4_4_;
    auVar249._4_4_ = fVar196 * fVar196;
    fVar236 = auVar110._8_4_;
    auVar249._8_4_ = fVar236 * fVar236;
    fVar197 = auVar110._12_4_;
    auVar249._12_4_ = fVar197 * fVar197;
    fVar237 = auVar110._16_4_;
    auVar249._16_4_ = fVar237 * fVar237;
    fVar198 = auVar110._20_4_;
    auVar249._20_4_ = fVar198 * fVar198;
    fVar240 = auVar110._24_4_;
    auVar249._28_36_ = auVar296._28_36_;
    auVar249._24_4_ = fVar240 * fVar240;
    fVar253 = auVar110._28_4_;
    fVar241 = (auVar249._0_4_ * (fVar235 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar251 = (auVar249._4_4_ * (fVar196 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar254 = (auVar249._8_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar257 = (auVar249._12_4_ * (fVar197 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar259 = (auVar249._16_4_ * (fVar237 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar261 = (auVar249._20_4_ * (fVar198 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar263 = (auVar249._24_4_ * (fVar240 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar316 = -fVar235 * auVar191._0_4_ * auVar191._0_4_ * 0.5;
    fVar324 = -fVar196 * auVar191._4_4_ * auVar191._4_4_ * 0.5;
    fVar328 = -fVar236 * auVar191._8_4_ * auVar191._8_4_ * 0.5;
    fVar332 = -fVar197 * auVar191._12_4_ * auVar191._12_4_ * 0.5;
    fVar336 = -fVar237 * auVar191._16_4_ * auVar191._16_4_ * 0.5;
    fVar340 = -fVar198 * auVar191._20_4_ * auVar191._20_4_ * 0.5;
    fVar344 = -fVar240 * auVar191._24_4_ * auVar191._24_4_ * 0.5;
    fVar182 = auVar386._28_4_;
    fVar355 = auVar354._28_4_ + fVar182;
    fVar359 = auVar358._28_4_ + fVar182;
    fVar378 = (auVar191._0_4_ * auVar191._0_4_ * (fVar256 + -5.0) + 2.0) * 0.5;
    fVar387 = (auVar191._4_4_ * auVar191._4_4_ * (fVar214 + -5.0) + 2.0) * 0.5;
    fVar389 = (auVar191._8_4_ * auVar191._8_4_ * (fVar215 + -5.0) + 2.0) * 0.5;
    fVar390 = (auVar191._12_4_ * auVar191._12_4_ * (fVar216 + -5.0) + 2.0) * 0.5;
    fVar391 = (auVar191._16_4_ * auVar191._16_4_ * (fVar217 + -5.0) + 2.0) * 0.5;
    fVar392 = (auVar191._20_4_ * auVar191._20_4_ * (fVar218 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar191._24_4_ * auVar191._24_4_ * (fVar219 + -5.0) + 2.0) * 0.5;
    fVar360 = -auVar191._0_4_ * fVar235 * fVar235 * 0.5;
    fVar366 = -auVar191._4_4_ * fVar196 * fVar196 * 0.5;
    fVar368 = -auVar191._8_4_ * fVar236 * fVar236 * 0.5;
    fVar370 = -auVar191._12_4_ * fVar197 * fVar197 * 0.5;
    fVar372 = -auVar191._16_4_ * fVar237 * fVar237 * 0.5;
    fVar374 = -auVar191._20_4_ * fVar198 * fVar198 * 0.5;
    fVar376 = -auVar191._24_4_ * fVar240 * fVar240 * 0.5;
    fVar317 = fVar360 * (float)local_340._0_4_ +
              fVar378 * (float)local_360._0_4_ +
              fVar316 * (float)local_440._0_4_ + fVar241 * (float)local_3c0._0_4_;
    fVar325 = fVar366 * (float)local_340._4_4_ +
              fVar387 * (float)local_360._4_4_ +
              fVar324 * (float)local_440._4_4_ + fVar251 * (float)local_3c0._4_4_;
    fVar329 = fVar368 * fStack_338 +
              fVar389 * fStack_358 + fVar328 * fStack_438 + fVar254 * fStack_3b8;
    fVar333 = fVar370 * fStack_334 +
              fVar390 * fStack_354 + fVar332 * fStack_434 + fVar257 * fStack_3b4;
    fVar337 = fVar372 * fStack_330 +
              fVar391 * fStack_350 + fVar336 * fStack_430 + fVar259 * fStack_3b0;
    fVar341 = fVar374 * fStack_32c +
              fVar392 * fStack_34c + fVar340 * fStack_42c + fVar261 * fStack_3ac;
    fVar345 = fVar376 * fStack_328 +
              fVar393 * fStack_348 + fVar344 * fStack_428 + fVar263 * fStack_3a8;
    fVar349 = fVar182 + 2.0 + -fVar253 + fVar355;
    fVar318 = (float)local_1a0._0_4_ * fVar360 +
              fVar378 * (float)local_380._0_4_ +
              fVar316 * (float)local_460._0_4_ + fVar241 * (float)local_3e0._0_4_;
    fVar326 = (float)local_1a0._4_4_ * fVar366 +
              fVar387 * (float)local_380._4_4_ +
              fVar324 * (float)local_460._4_4_ + fVar251 * (float)local_3e0._4_4_;
    fVar330 = fStack_198 * fVar368 +
              fVar389 * fStack_378 + fVar328 * fStack_458 + fVar254 * fStack_3d8;
    fVar334 = fStack_194 * fVar370 +
              fVar390 * fStack_374 + fVar332 * fStack_454 + fVar257 * fStack_3d4;
    fVar338 = fStack_190 * fVar372 +
              fVar391 * fStack_370 + fVar336 * fStack_450 + fVar259 * fStack_3d0;
    fVar342 = fStack_18c * fVar374 +
              fVar392 * fStack_36c + fVar340 * fStack_44c + fVar261 * fStack_3cc;
    fVar346 = fStack_188 * fVar376 +
              fVar393 * fStack_368 + fVar344 * fStack_448 + fVar263 * fStack_3c8;
    fVar350 = fVar349 + fVar355 + fVar359;
    fVar319 = (float)local_1c0._0_4_ * fVar360 +
              fVar378 * (float)local_3a0._0_4_ +
              fVar316 * (float)local_480._0_4_ + fVar241 * (float)local_400._0_4_;
    fVar327 = (float)local_1c0._4_4_ * fVar366 +
              fVar387 * (float)local_3a0._4_4_ +
              fVar324 * (float)local_480._4_4_ + fVar251 * (float)local_400._4_4_;
    fVar331 = fStack_1b8 * fVar368 +
              fVar389 * fStack_398 + fVar328 * fStack_478 + fVar254 * fStack_3f8;
    fVar335 = fStack_1b4 * fVar370 +
              fVar390 * fStack_394 + fVar332 * fStack_474 + fVar257 * fStack_3f4;
    fVar339 = fStack_1b0 * fVar372 +
              fVar391 * fStack_390 + fVar336 * fStack_470 + fVar259 * fStack_3f0;
    fVar343 = fStack_1ac * fVar374 +
              fVar392 * fStack_38c + fVar340 * fStack_46c + fVar261 * fStack_3ec;
    fVar347 = fStack_1a8 * fVar376 +
              fVar393 * fStack_388 + fVar344 * fStack_468 + fVar263 * fStack_3e8;
    fVar351 = fVar350 + fVar359 + auVar365._28_4_ + fVar182;
    local_7a0._0_4_ =
         (float)local_1e0._0_4_ * fVar360 +
         (float)local_200._0_4_ * fVar378 +
         fVar316 * (float)local_220._0_4_ + fVar241 * (float)local_420._0_4_;
    local_7a0._4_4_ =
         (float)local_1e0._4_4_ * fVar366 +
         (float)local_200._4_4_ * fVar387 +
         fVar324 * (float)local_220._4_4_ + fVar251 * (float)local_420._4_4_;
    local_7a0._8_4_ =
         fStack_1d8 * fVar368 + fStack_1f8 * fVar389 + fVar328 * fStack_218 + fVar254 * fStack_418;
    local_7a0._12_4_ =
         fStack_1d4 * fVar370 + fStack_1f4 * fVar390 + fVar332 * fStack_214 + fVar257 * fStack_414;
    local_7a0._16_4_ =
         fStack_1d0 * fVar372 + fStack_1f0 * fVar391 + fVar336 * fStack_210 + fVar259 * fStack_410;
    local_7a0._20_4_ =
         fStack_1cc * fVar374 + fStack_1ec * fVar392 + fVar340 * fStack_20c + fVar261 * fStack_40c;
    local_7a0._24_4_ =
         fStack_1c8 * fVar376 + fStack_1e8 * fVar393 + fVar344 * fStack_208 + fVar263 * fStack_408;
    local_7a0._28_4_ = fVar351 + fVar182 + 2.0 + -fVar253 + -3.0;
    auVar16._4_4_ = (fVar196 + fVar196) * auVar191._4_4_;
    auVar16._0_4_ = (fVar235 + fVar235) * auVar191._0_4_;
    auVar16._8_4_ = (fVar236 + fVar236) * auVar191._8_4_;
    auVar16._12_4_ = (fVar197 + fVar197) * auVar191._12_4_;
    auVar16._16_4_ = (fVar237 + fVar237) * auVar191._16_4_;
    auVar16._20_4_ = (fVar198 + fVar198) * auVar191._20_4_;
    auVar16._24_4_ = (fVar240 + fVar240) * auVar191._24_4_;
    auVar16._28_4_ = auVar191._28_4_ + auVar191._28_4_;
    auVar110 = vsubps_avx(auVar16,auVar249._0_32_);
    fVar263 = auVar210._28_4_ + 2.0;
    auVar17._4_4_ = (fVar196 + fVar196) * (fVar214 + 2.0);
    auVar17._0_4_ = (fVar235 + fVar235) * (fVar256 + 2.0);
    auVar17._8_4_ = (fVar236 + fVar236) * (fVar215 + 2.0);
    auVar17._12_4_ = (fVar197 + fVar197) * (fVar216 + 2.0);
    auVar17._16_4_ = (fVar237 + fVar237) * (fVar217 + 2.0);
    auVar17._20_4_ = (fVar198 + fVar198) * (fVar218 + 2.0);
    auVar17._24_4_ = (fVar240 + fVar240) * (fVar219 + 2.0);
    auVar17._28_4_ = fVar263;
    auVar18._4_4_ = fVar196 * fVar196 * 3.0;
    auVar18._0_4_ = fVar235 * fVar235 * 3.0;
    auVar18._8_4_ = fVar236 * fVar236 * 3.0;
    auVar18._12_4_ = fVar197 * fVar197 * 3.0;
    auVar18._16_4_ = fVar237 * fVar237 * 3.0;
    auVar18._20_4_ = fVar198 * fVar198 * 3.0;
    auVar18._24_4_ = fVar240 * fVar240 * 3.0;
    auVar18._28_4_ = fVar253;
    auVar111 = vsubps_avx(auVar17,auVar18);
    auVar16 = vsubps_avx(_local_9e0,auVar16);
    fVar336 = auVar110._0_4_ * 0.5;
    fVar340 = auVar110._4_4_ * 0.5;
    fVar344 = auVar110._8_4_ * 0.5;
    fVar355 = auVar110._12_4_ * 0.5;
    fVar359 = auVar110._16_4_ * 0.5;
    fVar360 = auVar110._20_4_ * 0.5;
    fVar366 = auVar110._24_4_ * 0.5;
    fVar254 = (auVar191._0_4_ * fVar256 + (auVar191._0_4_ + auVar191._0_4_) * (fVar256 + -5.0)) *
              0.5;
    fVar257 = (auVar191._4_4_ * fVar214 + (auVar191._4_4_ + auVar191._4_4_) * (fVar214 + -5.0)) *
              0.5;
    fVar259 = (auVar191._8_4_ * fVar215 + (auVar191._8_4_ + auVar191._8_4_) * (fVar215 + -5.0)) *
              0.5;
    fVar316 = (auVar191._12_4_ * fVar216 + (auVar191._12_4_ + auVar191._12_4_) * (fVar216 + -5.0)) *
              0.5;
    fVar324 = (auVar191._16_4_ * fVar217 + (auVar191._16_4_ + auVar191._16_4_) * (fVar217 + -5.0)) *
              0.5;
    fVar328 = (auVar191._20_4_ * fVar218 + (auVar191._20_4_ + auVar191._20_4_) * (fVar218 + -5.0)) *
              0.5;
    fVar332 = (auVar191._24_4_ * fVar219 + (auVar191._24_4_ + auVar191._24_4_) * (fVar219 + -5.0)) *
              0.5;
    fVar182 = auVar111._0_4_ * 0.5;
    fVar235 = auVar111._4_4_ * 0.5;
    fVar196 = auVar111._8_4_ * 0.5;
    fVar236 = auVar111._12_4_ * 0.5;
    fVar197 = auVar111._16_4_ * 0.5;
    fVar237 = auVar111._20_4_ * 0.5;
    fVar256 = auVar111._24_4_ * 0.5;
    fVar198 = auVar16._0_4_ * 0.5;
    fVar240 = auVar16._4_4_ * 0.5;
    fVar214 = auVar16._8_4_ * 0.5;
    fVar215 = auVar16._12_4_ * 0.5;
    fVar216 = auVar16._16_4_ * 0.5;
    fVar241 = auVar16._20_4_ * 0.5;
    fVar251 = auVar16._24_4_ * 0.5;
    fVar315 = fVar253 + fVar253 + auVar110._28_4_;
    fVar286 = fVar315 + fVar253 + fVar253 + 2.0;
    fVar263 = fVar263 + auVar191._28_4_ + auVar210._28_4_ + -5.0 + auVar111._28_4_ + auVar16._28_4_;
    auVar126 = vpermilps_avx(ZEXT416((uint)(fVar250 * 0.04761905)),0);
    fVar218 = auVar126._0_4_;
    fVar265 = fVar218 * (fVar336 * (float)local_340._0_4_ +
                        fVar254 * (float)local_360._0_4_ +
                        fVar182 * (float)local_3c0._0_4_ + fVar198 * (float)local_440._0_4_);
    fVar219 = auVar126._4_4_;
    fVar275 = fVar219 * (fVar340 * (float)local_340._4_4_ +
                        fVar257 * (float)local_360._4_4_ +
                        fVar235 * (float)local_3c0._4_4_ + fVar240 * (float)local_440._4_4_);
    local_b00._4_4_ = fVar275;
    local_b00._0_4_ = fVar265;
    fVar261 = auVar126._8_4_;
    fVar276 = fVar261 * (fVar344 * fStack_338 +
                        fVar259 * fStack_358 + fVar196 * fStack_3b8 + fVar214 * fStack_438);
    local_b00._8_4_ = fVar276;
    fVar217 = auVar126._12_4_;
    fVar278 = fVar217 * (fVar355 * fStack_334 +
                        fVar316 * fStack_354 + fVar236 * fStack_3b4 + fVar215 * fStack_434);
    local_b00._12_4_ = fVar278;
    fVar280 = fVar218 * (fVar359 * fStack_330 +
                        fVar324 * fStack_350 + fVar197 * fStack_3b0 + fVar216 * fStack_430);
    local_b00._16_4_ = fVar280;
    fVar282 = fVar219 * (fVar360 * fStack_32c +
                        fVar328 * fStack_34c + fVar237 * fStack_3ac + fVar241 * fStack_42c);
    local_b00._20_4_ = fVar282;
    fVar284 = fVar261 * (fVar366 * fStack_328 +
                        fVar332 * fStack_348 + fVar256 * fStack_3a8 + fVar251 * fStack_428);
    local_b00._24_4_ = fVar284;
    local_b00._28_4_ = fVar286;
    fVar287 = fVar218 * ((float)local_1a0._0_4_ * fVar336 +
                        fVar254 * (float)local_380._0_4_ +
                        fVar182 * (float)local_3e0._0_4_ + fVar198 * (float)local_460._0_4_);
    fVar297 = fVar219 * ((float)local_1a0._4_4_ * fVar340 +
                        fVar257 * (float)local_380._4_4_ +
                        fVar235 * (float)local_3e0._4_4_ + fVar240 * (float)local_460._4_4_);
    local_8e0._4_4_ = fVar297;
    local_8e0._0_4_ = fVar287;
    fVar300 = fVar261 * (fStack_198 * fVar344 +
                        fVar259 * fStack_378 + fVar196 * fStack_3d8 + fVar214 * fStack_458);
    local_8e0._8_4_ = fVar300;
    fVar303 = fVar217 * (fStack_194 * fVar355 +
                        fVar316 * fStack_374 + fVar236 * fStack_3d4 + fVar215 * fStack_454);
    local_8e0._12_4_ = fVar303;
    fVar306 = fVar218 * (fStack_190 * fVar359 +
                        fVar324 * fStack_370 + fVar197 * fStack_3d0 + fVar216 * fStack_450);
    local_8e0._16_4_ = fVar306;
    fVar309 = fVar219 * (fStack_18c * fVar360 +
                        fVar328 * fStack_36c + fVar237 * fStack_3cc + fVar241 * fStack_44c);
    local_8e0._20_4_ = fVar309;
    fVar312 = fVar261 * (fStack_188 * fVar366 +
                        fVar332 * fStack_368 + fVar256 * fStack_3c8 + fVar251 * fStack_448);
    local_8e0._24_4_ = fVar312;
    local_8e0._28_4_ = fVar315;
    fVar361 = fVar218 * ((float)local_1c0._0_4_ * fVar336 +
                        fVar182 * (float)local_400._0_4_ + fVar198 * (float)local_480._0_4_ +
                        fVar254 * (float)local_3a0._0_4_);
    fVar367 = fVar219 * ((float)local_1c0._4_4_ * fVar340 +
                        fVar235 * (float)local_400._4_4_ + fVar240 * (float)local_480._4_4_ +
                        fVar257 * (float)local_3a0._4_4_);
    auVar25._4_4_ = fVar367;
    auVar25._0_4_ = fVar361;
    fVar369 = fVar261 * (fStack_1b8 * fVar344 +
                        fVar196 * fStack_3f8 + fVar214 * fStack_478 + fVar259 * fStack_398);
    auVar25._8_4_ = fVar369;
    fVar371 = fVar217 * (fStack_1b4 * fVar355 +
                        fVar236 * fStack_3f4 + fVar215 * fStack_474 + fVar316 * fStack_394);
    auVar25._12_4_ = fVar371;
    fVar373 = fVar218 * (fStack_1b0 * fVar359 +
                        fVar197 * fStack_3f0 + fVar216 * fStack_470 + fVar324 * fStack_390);
    auVar25._16_4_ = fVar373;
    fVar375 = fVar219 * (fStack_1ac * fVar360 +
                        fVar237 * fStack_3ec + fVar241 * fStack_46c + fVar328 * fStack_38c);
    auVar25._20_4_ = fVar375;
    fVar377 = fVar261 * (fStack_1a8 * fVar366 +
                        fVar256 * fStack_3e8 + fVar251 * fStack_468 + fVar332 * fStack_388);
    auVar25._24_4_ = fVar377;
    auVar25._28_4_ = -auVar191._28_4_;
    fVar198 = fVar218 * ((float)local_1e0._0_4_ * fVar336 +
                        (float)local_200._0_4_ * fVar254 +
                        fVar182 * (float)local_420._0_4_ + (float)local_220._0_4_ * fVar198);
    fVar240 = fVar219 * ((float)local_1e0._4_4_ * fVar340 +
                        (float)local_200._4_4_ * fVar257 +
                        fVar235 * (float)local_420._4_4_ + (float)local_220._4_4_ * fVar240);
    auVar19._4_4_ = fVar240;
    auVar19._0_4_ = fVar198;
    fVar250 = fVar261 * (fStack_1d8 * fVar344 +
                        fStack_1f8 * fVar259 + fVar196 * fStack_418 + fStack_218 * fVar214);
    auVar19._8_4_ = fVar250;
    fVar217 = fVar217 * (fStack_1d4 * fVar355 +
                        fStack_1f4 * fVar316 + fVar236 * fStack_414 + fStack_214 * fVar215);
    auVar19._12_4_ = fVar217;
    fVar218 = fVar218 * (fStack_1d0 * fVar359 +
                        fStack_1f0 * fVar324 + fVar197 * fStack_410 + fStack_210 * fVar216);
    auVar19._16_4_ = fVar218;
    fVar219 = fVar219 * (fStack_1cc * fVar360 +
                        fStack_1ec * fVar328 + fVar237 * fStack_40c + fStack_20c * fVar241);
    auVar19._20_4_ = fVar219;
    fVar261 = fVar261 * (fStack_1c8 * fVar366 +
                        fStack_1e8 * fVar332 + fVar256 * fStack_408 + fStack_208 * fVar251);
    auVar19._24_4_ = fVar261;
    auVar19._28_4_ = fVar263;
    auVar76._4_4_ = fVar326;
    auVar76._0_4_ = fVar318;
    auVar76._8_4_ = fVar330;
    auVar76._12_4_ = fVar334;
    auVar76._16_4_ = fVar338;
    auVar76._20_4_ = fVar342;
    auVar76._24_4_ = fVar346;
    auVar76._28_4_ = fVar350;
    auVar110 = vperm2f128_avx(auVar76,auVar76,1);
    auVar110 = vshufps_avx(auVar110,auVar76,0x30);
    local_9c0 = vshufps_avx(auVar76,auVar110,0x29);
    auVar78._4_4_ = fVar327;
    auVar78._0_4_ = fVar319;
    auVar78._8_4_ = fVar331;
    auVar78._12_4_ = fVar335;
    auVar78._16_4_ = fVar339;
    auVar78._20_4_ = fVar343;
    auVar78._24_4_ = fVar347;
    auVar78._28_4_ = fVar351;
    auVar110 = vperm2f128_avx(auVar78,auVar78,1);
    auVar110 = vshufps_avx(auVar110,auVar78,0x30);
    _local_9e0 = vshufps_avx(auVar78,auVar110,0x29);
    auVar111 = vsubps_avx(local_7a0,auVar19);
    auVar110 = vperm2f128_avx(auVar111,auVar111,1);
    auVar110 = vshufps_avx(auVar110,auVar111,0x30);
    local_640 = vshufps_avx(auVar111,auVar110,0x29);
    local_5a0 = vsubps_avx(local_9c0,auVar76);
    local_580 = vsubps_avx(_local_9e0,auVar78);
    fVar235 = local_5a0._0_4_;
    fVar253 = local_5a0._4_4_;
    auVar20._4_4_ = fVar367 * fVar253;
    auVar20._0_4_ = fVar361 * fVar235;
    fVar241 = local_5a0._8_4_;
    auVar20._8_4_ = fVar369 * fVar241;
    fVar324 = local_5a0._12_4_;
    auVar20._12_4_ = fVar371 * fVar324;
    fVar360 = local_5a0._16_4_;
    auVar20._16_4_ = fVar373 * fVar360;
    fVar387 = local_5a0._20_4_;
    auVar20._20_4_ = fVar375 * fVar387;
    fVar8 = local_5a0._24_4_;
    auVar20._24_4_ = fVar377 * fVar8;
    auVar20._28_4_ = auVar111._28_4_;
    fVar196 = local_580._0_4_;
    fVar256 = local_580._4_4_;
    auVar21._4_4_ = fVar297 * fVar256;
    auVar21._0_4_ = fVar287 * fVar196;
    fVar251 = local_580._8_4_;
    auVar21._8_4_ = fVar300 * fVar251;
    fVar328 = local_580._12_4_;
    auVar21._12_4_ = fVar303 * fVar328;
    fVar366 = local_580._16_4_;
    auVar21._16_4_ = fVar306 * fVar366;
    fVar389 = local_580._20_4_;
    auVar21._20_4_ = fVar309 * fVar389;
    fVar9 = local_580._24_4_;
    auVar21._24_4_ = fVar312 * fVar9;
    auVar21._28_4_ = auVar110._28_4_;
    auVar210 = vsubps_avx(auVar21,auVar20);
    auVar80._4_4_ = fVar325;
    auVar80._0_4_ = fVar317;
    auVar80._8_4_ = fVar329;
    auVar80._12_4_ = fVar333;
    auVar80._16_4_ = fVar337;
    auVar80._20_4_ = fVar341;
    auVar80._24_4_ = fVar345;
    auVar80._28_4_ = fVar349;
    auVar110 = vperm2f128_avx(auVar80,auVar80,1);
    auVar110 = vshufps_avx(auVar110,auVar80,0x30);
    auVar16 = vshufps_avx(auVar80,auVar110,0x29);
    local_5c0 = vsubps_avx(auVar16,auVar80);
    auVar22._4_4_ = fVar256 * fVar275;
    auVar22._0_4_ = fVar196 * fVar265;
    auVar22._8_4_ = fVar251 * fVar276;
    auVar22._12_4_ = fVar328 * fVar278;
    auVar22._16_4_ = fVar366 * fVar280;
    auVar22._20_4_ = fVar389 * fVar282;
    auVar22._24_4_ = fVar9 * fVar284;
    auVar22._28_4_ = auVar110._28_4_;
    fVar236 = local_5c0._0_4_;
    fVar214 = local_5c0._4_4_;
    auVar23._4_4_ = fVar367 * fVar214;
    auVar23._0_4_ = fVar361 * fVar236;
    fVar254 = local_5c0._8_4_;
    auVar23._8_4_ = fVar369 * fVar254;
    fVar332 = local_5c0._12_4_;
    auVar23._12_4_ = fVar371 * fVar332;
    fVar368 = local_5c0._16_4_;
    auVar23._16_4_ = fVar373 * fVar368;
    fVar390 = local_5c0._20_4_;
    auVar23._20_4_ = fVar375 * fVar390;
    fVar10 = local_5c0._24_4_;
    auVar23._24_4_ = fVar377 * fVar10;
    auVar23._28_4_ = fVar349;
    auVar17 = vsubps_avx(auVar23,auVar22);
    auVar24._4_4_ = fVar297 * fVar214;
    auVar24._0_4_ = fVar287 * fVar236;
    auVar24._8_4_ = fVar300 * fVar254;
    auVar24._12_4_ = fVar303 * fVar332;
    auVar24._16_4_ = fVar306 * fVar368;
    auVar24._20_4_ = fVar309 * fVar390;
    auVar24._24_4_ = fVar312 * fVar10;
    auVar24._28_4_ = fVar349;
    auVar271._4_4_ = fVar253 * fVar275;
    auVar271._0_4_ = fVar235 * fVar265;
    auVar271._8_4_ = fVar241 * fVar276;
    auVar271._12_4_ = fVar324 * fVar278;
    auVar271._16_4_ = fVar360 * fVar280;
    auVar271._20_4_ = fVar387 * fVar282;
    auVar271._24_4_ = fVar8 * fVar284;
    auVar271._28_4_ = fVar351;
    auVar18 = vsubps_avx(auVar271,auVar24);
    fVar182 = auVar18._28_4_;
    fVar316 = auVar17._28_4_ + fVar182;
    auVar192._0_4_ = fVar236 * fVar236 + fVar235 * fVar235 + fVar196 * fVar196;
    auVar192._4_4_ = fVar214 * fVar214 + fVar253 * fVar253 + fVar256 * fVar256;
    auVar192._8_4_ = fVar254 * fVar254 + fVar241 * fVar241 + fVar251 * fVar251;
    auVar192._12_4_ = fVar332 * fVar332 + fVar324 * fVar324 + fVar328 * fVar328;
    auVar192._16_4_ = fVar368 * fVar368 + fVar360 * fVar360 + fVar366 * fVar366;
    auVar192._20_4_ = fVar390 * fVar390 + fVar387 * fVar387 + fVar389 * fVar389;
    auVar192._24_4_ = fVar10 * fVar10 + fVar8 * fVar8 + fVar9 * fVar9;
    auVar192._28_4_ = fVar182 + fVar182 + fVar316;
    auVar110 = vrcpps_avx(auVar192);
    fVar344 = auVar110._0_4_;
    fVar355 = auVar110._4_4_;
    auVar26._4_4_ = fVar355 * auVar192._4_4_;
    auVar26._0_4_ = fVar344 * auVar192._0_4_;
    fVar359 = auVar110._8_4_;
    auVar26._8_4_ = fVar359 * auVar192._8_4_;
    fVar374 = auVar110._12_4_;
    auVar26._12_4_ = fVar374 * auVar192._12_4_;
    fVar376 = auVar110._16_4_;
    auVar26._16_4_ = fVar376 * auVar192._16_4_;
    fVar378 = auVar110._20_4_;
    auVar26._20_4_ = fVar378 * auVar192._20_4_;
    fVar393 = auVar110._24_4_;
    auVar26._24_4_ = fVar393 * auVar192._24_4_;
    auVar26._28_4_ = fVar351;
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = &DAT_3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar112,auVar26);
    fVar344 = auVar19._0_4_ * fVar344 + fVar344;
    fVar355 = auVar19._4_4_ * fVar355 + fVar355;
    fVar359 = auVar19._8_4_ * fVar359 + fVar359;
    fVar374 = auVar19._12_4_ * fVar374 + fVar374;
    fVar376 = auVar19._16_4_ * fVar376 + fVar376;
    fVar378 = auVar19._20_4_ * fVar378 + fVar378;
    fVar393 = auVar19._24_4_ * fVar393 + fVar393;
    auVar111 = vperm2f128_avx(local_8e0,local_8e0,1);
    auVar111 = vshufps_avx(auVar111,local_8e0,0x30);
    local_aa0 = vshufps_avx(local_8e0,auVar111,0x29);
    auVar111 = vperm2f128_avx(auVar25,auVar25,1);
    auVar111 = vshufps_avx(auVar111,auVar25,0x30);
    local_ac0 = vshufps_avx(auVar25,auVar111,0x29);
    fVar288 = local_ac0._0_4_;
    fVar298 = local_ac0._4_4_;
    auVar27._4_4_ = fVar298 * fVar253;
    auVar27._0_4_ = fVar288 * fVar235;
    fVar301 = local_ac0._8_4_;
    auVar27._8_4_ = fVar301 * fVar241;
    fVar304 = local_ac0._12_4_;
    auVar27._12_4_ = fVar304 * fVar324;
    fVar307 = local_ac0._16_4_;
    auVar27._16_4_ = fVar307 * fVar360;
    fVar310 = local_ac0._20_4_;
    auVar27._20_4_ = fVar310 * fVar387;
    fVar313 = local_ac0._24_4_;
    auVar27._24_4_ = fVar313 * fVar8;
    auVar27._28_4_ = auVar111._28_4_;
    fVar197 = local_aa0._0_4_;
    fVar215 = local_aa0._4_4_;
    auVar28._4_4_ = fVar256 * fVar215;
    auVar28._0_4_ = fVar196 * fVar197;
    fVar257 = local_aa0._8_4_;
    auVar28._8_4_ = fVar251 * fVar257;
    fVar336 = local_aa0._12_4_;
    auVar28._12_4_ = fVar328 * fVar336;
    fVar370 = local_aa0._16_4_;
    auVar28._16_4_ = fVar366 * fVar370;
    fVar391 = local_aa0._20_4_;
    auVar28._20_4_ = fVar389 * fVar391;
    fVar11 = local_aa0._24_4_;
    auVar28._24_4_ = fVar9 * fVar11;
    auVar28._28_4_ = -auVar191._28_4_;
    auVar20 = vsubps_avx(auVar28,auVar27);
    auVar111 = vperm2f128_avx(local_b00,local_b00,1);
    auVar111 = vshufps_avx(auVar111,local_b00,0x30);
    local_780 = vshufps_avx(local_b00,auVar111,0x29);
    fVar237 = local_780._0_4_;
    fVar216 = local_780._4_4_;
    auVar29._4_4_ = fVar256 * fVar216;
    auVar29._0_4_ = fVar196 * fVar237;
    fVar259 = local_780._8_4_;
    auVar29._8_4_ = fVar251 * fVar259;
    fVar340 = local_780._12_4_;
    auVar29._12_4_ = fVar328 * fVar340;
    fVar372 = local_780._16_4_;
    auVar29._16_4_ = fVar366 * fVar372;
    fVar392 = local_780._20_4_;
    auVar29._20_4_ = fVar389 * fVar392;
    fVar12 = local_780._24_4_;
    auVar29._24_4_ = fVar9 * fVar12;
    auVar29._28_4_ = auVar111._28_4_;
    auVar30._4_4_ = fVar298 * fVar214;
    auVar30._0_4_ = fVar288 * fVar236;
    auVar30._8_4_ = fVar301 * fVar254;
    auVar30._12_4_ = fVar304 * fVar332;
    auVar30._16_4_ = fVar307 * fVar368;
    auVar30._20_4_ = fVar310 * fVar390;
    auVar30._24_4_ = fVar313 * fVar10;
    auVar30._28_4_ = uStack_184;
    auVar21 = vsubps_avx(auVar30,auVar29);
    auVar31._4_4_ = fVar214 * fVar215;
    auVar31._0_4_ = fVar236 * fVar197;
    auVar31._8_4_ = fVar254 * fVar257;
    auVar31._12_4_ = fVar332 * fVar336;
    auVar31._16_4_ = fVar368 * fVar370;
    auVar31._20_4_ = fVar390 * fVar391;
    auVar31._24_4_ = fVar10 * fVar11;
    auVar31._28_4_ = uStack_184;
    auVar32._4_4_ = fVar253 * fVar216;
    auVar32._0_4_ = fVar235 * fVar237;
    auVar32._8_4_ = fVar241 * fVar259;
    auVar32._12_4_ = fVar324 * fVar340;
    auVar32._16_4_ = fVar360 * fVar372;
    auVar32._20_4_ = fVar387 * fVar392;
    auVar32._24_4_ = fVar8 * fVar12;
    auVar32._28_4_ = fStack_1a4;
    auVar111 = vsubps_avx(auVar32,auVar31);
    fVar182 = auVar111._28_4_;
    auVar33._4_4_ =
         (auVar210._4_4_ * auVar210._4_4_ +
         auVar17._4_4_ * auVar17._4_4_ + auVar18._4_4_ * auVar18._4_4_) * fVar355;
    auVar33._0_4_ =
         (auVar210._0_4_ * auVar210._0_4_ +
         auVar17._0_4_ * auVar17._0_4_ + auVar18._0_4_ * auVar18._0_4_) * fVar344;
    auVar33._8_4_ =
         (auVar210._8_4_ * auVar210._8_4_ +
         auVar17._8_4_ * auVar17._8_4_ + auVar18._8_4_ * auVar18._8_4_) * fVar359;
    auVar33._12_4_ =
         (auVar210._12_4_ * auVar210._12_4_ +
         auVar17._12_4_ * auVar17._12_4_ + auVar18._12_4_ * auVar18._12_4_) * fVar374;
    auVar33._16_4_ =
         (auVar210._16_4_ * auVar210._16_4_ +
         auVar17._16_4_ * auVar17._16_4_ + auVar18._16_4_ * auVar18._16_4_) * fVar376;
    auVar33._20_4_ =
         (auVar210._20_4_ * auVar210._20_4_ +
         auVar17._20_4_ * auVar17._20_4_ + auVar18._20_4_ * auVar18._20_4_) * fVar378;
    auVar33._24_4_ =
         (auVar210._24_4_ * auVar210._24_4_ +
         auVar17._24_4_ * auVar17._24_4_ + auVar18._24_4_ * auVar18._24_4_) * fVar393;
    auVar33._28_4_ = auVar210._28_4_ + fVar316;
    auVar34._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar21._4_4_ * auVar21._4_4_ + auVar111._4_4_ * auVar111._4_4_) * fVar355;
    auVar34._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar21._0_4_ * auVar21._0_4_ + auVar111._0_4_ * auVar111._0_4_) * fVar344;
    auVar34._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar21._8_4_ * auVar21._8_4_ + auVar111._8_4_ * auVar111._8_4_) * fVar359;
    auVar34._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar21._12_4_ * auVar21._12_4_ + auVar111._12_4_ * auVar111._12_4_) * fVar374;
    auVar34._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar21._16_4_ * auVar21._16_4_ + auVar111._16_4_ * auVar111._16_4_) * fVar376;
    auVar34._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar21._20_4_ * auVar21._20_4_ + auVar111._20_4_ * auVar111._20_4_) * fVar378;
    auVar34._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar21._24_4_ * auVar21._24_4_ + auVar111._24_4_ * auVar111._24_4_) * fVar393;
    auVar34._28_4_ = auVar19._28_4_ + auVar110._28_4_;
    auVar110 = vmaxps_avx(auVar33,auVar34);
    auVar111 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar111 = vshufps_avx(auVar111,local_7a0,0x30);
    auVar17 = vshufps_avx(local_7a0,auVar111,0x29);
    auVar139._0_4_ = (float)local_7a0._0_4_ + fVar198;
    auVar139._4_4_ = local_7a0._4_4_ + fVar240;
    auVar139._8_4_ = local_7a0._8_4_ + fVar250;
    auVar139._12_4_ = local_7a0._12_4_ + fVar217;
    auVar139._16_4_ = local_7a0._16_4_ + fVar218;
    auVar139._20_4_ = local_7a0._20_4_ + fVar219;
    auVar139._24_4_ = local_7a0._24_4_ + fVar261;
    auVar139._28_4_ = local_7a0._28_4_ + fVar263;
    auVar111 = vmaxps_avx(local_7a0,auVar139);
    auVar210 = vmaxps_avx(local_640,auVar17);
    auVar210 = vmaxps_avx(auVar111,auVar210);
    auVar111 = vrsqrtps_avx(auVar192);
    fVar198 = auVar111._0_4_;
    fVar240 = auVar111._4_4_;
    fVar250 = auVar111._8_4_;
    fVar217 = auVar111._12_4_;
    fVar218 = auVar111._16_4_;
    fVar219 = auVar111._20_4_;
    fVar261 = auVar111._24_4_;
    auVar35._4_4_ = fVar240 * fVar240 * fVar240 * auVar192._4_4_ * 0.5;
    auVar35._0_4_ = fVar198 * fVar198 * fVar198 * auVar192._0_4_ * 0.5;
    auVar35._8_4_ = fVar250 * fVar250 * fVar250 * auVar192._8_4_ * 0.5;
    auVar35._12_4_ = fVar217 * fVar217 * fVar217 * auVar192._12_4_ * 0.5;
    auVar35._16_4_ = fVar218 * fVar218 * fVar218 * auVar192._16_4_ * 0.5;
    auVar35._20_4_ = fVar219 * fVar219 * fVar219 * auVar192._20_4_ * 0.5;
    auVar35._24_4_ = fVar261 * fVar261 * fVar261 * auVar192._24_4_ * 0.5;
    auVar35._28_4_ = auVar192._28_4_;
    auVar36._4_4_ = fVar240 * 1.5;
    auVar36._0_4_ = fVar198 * 1.5;
    auVar36._8_4_ = fVar250 * 1.5;
    auVar36._12_4_ = fVar217 * 1.5;
    auVar36._16_4_ = fVar218 * 1.5;
    auVar36._20_4_ = fVar219 * 1.5;
    auVar36._24_4_ = fVar261 * 1.5;
    auVar36._28_4_ = auVar111._28_4_;
    auVar111 = vsubps_avx(auVar36,auVar35);
    auVar77._4_4_ = fVar326;
    auVar77._0_4_ = fVar318;
    auVar77._8_4_ = fVar330;
    auVar77._12_4_ = fVar334;
    auVar77._16_4_ = fVar338;
    auVar77._20_4_ = fVar342;
    auVar77._24_4_ = fVar346;
    auVar77._28_4_ = fVar350;
    local_ae0 = vsubps_avx(ZEXT832(0) << 0x20,auVar77);
    auVar79._4_4_ = fVar327;
    auVar79._0_4_ = fVar319;
    auVar79._8_4_ = fVar331;
    auVar79._12_4_ = fVar335;
    auVar79._16_4_ = fVar339;
    auVar79._20_4_ = fVar343;
    auVar79._24_4_ = fVar347;
    auVar79._28_4_ = fVar351;
    local_920 = vsubps_avx(ZEXT832(0) << 0x20,auVar79);
    fVar198 = local_920._0_4_;
    fVar217 = local_920._4_4_;
    fVar261 = local_920._8_4_;
    fVar344 = local_920._12_4_;
    fVar374 = local_920._16_4_;
    fVar393 = local_920._20_4_;
    fVar13 = local_920._24_4_;
    fVar240 = local_ae0._0_4_;
    fVar218 = local_ae0._4_4_;
    fVar263 = local_ae0._8_4_;
    fVar355 = local_ae0._12_4_;
    fVar376 = local_ae0._16_4_;
    fVar7 = local_ae0._20_4_;
    fVar14 = local_ae0._24_4_;
    auVar81._4_4_ = fVar325;
    auVar81._0_4_ = fVar317;
    auVar81._8_4_ = fVar329;
    auVar81._12_4_ = fVar333;
    auVar81._16_4_ = fVar337;
    auVar81._20_4_ = fVar341;
    auVar81._24_4_ = fVar345;
    auVar81._28_4_ = fVar349;
    auVar18 = vsubps_avx(ZEXT832(0) << 0x20,auVar81);
    auVar296 = ZEXT3264(auVar18);
    fVar289 = auVar18._0_4_;
    fVar299 = auVar18._4_4_;
    fVar302 = auVar18._8_4_;
    fVar305 = auVar18._12_4_;
    fVar308 = auVar18._16_4_;
    fVar311 = auVar18._20_4_;
    fVar314 = auVar18._24_4_;
    auVar363._0_4_ =
         fVar289 * (float)local_7c0._0_4_ +
         (float)local_7e0._0_4_ * fVar240 + (float)local_800._0_4_ * fVar198;
    auVar363._4_4_ =
         fVar299 * (float)local_7c0._4_4_ +
         (float)local_7e0._4_4_ * fVar218 + (float)local_800._4_4_ * fVar217;
    auVar363._8_4_ = fVar302 * fStack_7b8 + fStack_7d8 * fVar263 + fStack_7f8 * fVar261;
    auVar363._12_4_ = fVar305 * fStack_7b4 + fStack_7d4 * fVar355 + fStack_7f4 * fVar344;
    auVar363._16_4_ = fVar308 * fStack_7b0 + fStack_7d0 * fVar376 + fStack_7f0 * fVar374;
    auVar363._20_4_ = fVar311 * fStack_7ac + fStack_7cc * fVar7 + fStack_7ec * fVar393;
    auVar363._24_4_ = fVar314 * fStack_7a8 + fStack_7c8 * fVar14 + fStack_7e8 * fVar13;
    auVar363._28_4_ = fVar182 + fVar182 + auVar21._28_4_ + fVar182;
    auVar383._0_4_ = fVar289 * fVar289 + fVar240 * fVar240 + fVar198 * fVar198;
    auVar383._4_4_ = fVar299 * fVar299 + fVar218 * fVar218 + fVar217 * fVar217;
    auVar383._8_4_ = fVar302 * fVar302 + fVar263 * fVar263 + fVar261 * fVar261;
    auVar383._12_4_ = fVar305 * fVar305 + fVar355 * fVar355 + fVar344 * fVar344;
    auVar383._16_4_ = fVar308 * fVar308 + fVar376 * fVar376 + fVar374 * fVar374;
    auVar383._20_4_ = fVar311 * fVar311 + fVar7 * fVar7 + fVar393 * fVar393;
    auVar383._24_4_ = fVar314 * fVar314 + fVar14 * fVar14 + fVar13 * fVar13;
    auVar383._28_4_ = fStack_1a4 + fStack_1a4 + fVar182;
    fVar250 = auVar111._0_4_;
    fVar219 = auVar111._4_4_;
    fVar316 = auVar111._8_4_;
    fVar359 = auVar111._12_4_;
    fVar378 = auVar111._16_4_;
    fVar238 = auVar111._20_4_;
    fVar239 = auVar111._24_4_;
    fVar396 = (float)local_7c0._0_4_ * fVar236 * fVar250 +
              fVar235 * fVar250 * (float)local_7e0._0_4_ +
              fVar196 * fVar250 * (float)local_800._0_4_;
    fVar398 = (float)local_7c0._4_4_ * fVar214 * fVar219 +
              fVar253 * fVar219 * (float)local_7e0._4_4_ +
              fVar256 * fVar219 * (float)local_800._4_4_;
    fVar399 = fStack_7b8 * fVar254 * fVar316 +
              fVar241 * fVar316 * fStack_7d8 + fVar251 * fVar316 * fStack_7f8;
    fVar400 = fStack_7b4 * fVar332 * fVar359 +
              fVar324 * fVar359 * fStack_7d4 + fVar328 * fVar359 * fStack_7f4;
    fVar401 = fStack_7b0 * fVar368 * fVar378 +
              fVar360 * fVar378 * fStack_7d0 + fVar366 * fVar378 * fStack_7f0;
    fVar402 = fStack_7ac * fVar390 * fVar238 +
              fVar387 * fVar238 * fStack_7cc + fVar389 * fVar238 * fStack_7ec;
    fVar403 = fStack_7a8 * fVar10 * fVar239 +
              fVar8 * fVar239 * fStack_7c8 + fVar9 * fVar239 * fStack_7e8;
    fVar182 = fStack_7a4 + fStack_7c4 + fStack_7e4;
    local_4e0._0_4_ =
         fVar289 * fVar236 * fVar250 + fVar235 * fVar250 * fVar240 + fVar196 * fVar250 * fVar198;
    local_4e0._4_4_ =
         fVar299 * fVar214 * fVar219 + fVar253 * fVar219 * fVar218 + fVar256 * fVar219 * fVar217;
    local_4e0._8_4_ =
         fVar302 * fVar254 * fVar316 + fVar241 * fVar316 * fVar263 + fVar251 * fVar316 * fVar261;
    local_4e0._12_4_ =
         fVar305 * fVar332 * fVar359 + fVar324 * fVar359 * fVar355 + fVar328 * fVar359 * fVar344;
    local_4e0._16_4_ =
         fVar308 * fVar368 * fVar378 + fVar360 * fVar378 * fVar376 + fVar366 * fVar378 * fVar374;
    local_4e0._20_4_ =
         fVar311 * fVar390 * fVar238 + fVar387 * fVar238 * fVar7 + fVar389 * fVar238 * fVar393;
    local_4e0._24_4_ =
         fVar314 * fVar10 * fVar239 + fVar8 * fVar239 * fVar14 + fVar9 * fVar239 * fVar13;
    local_4e0._28_4_ = fStack_7c4 + fVar182;
    auVar354 = ZEXT3264(local_4e0);
    auVar37._4_4_ = fVar398 * local_4e0._4_4_;
    auVar37._0_4_ = fVar396 * local_4e0._0_4_;
    auVar37._8_4_ = fVar399 * local_4e0._8_4_;
    auVar37._12_4_ = fVar400 * local_4e0._12_4_;
    auVar37._16_4_ = fVar401 * local_4e0._16_4_;
    auVar37._20_4_ = fVar402 * local_4e0._20_4_;
    auVar37._24_4_ = fVar403 * local_4e0._24_4_;
    auVar37._28_4_ = fVar182;
    auVar19 = vsubps_avx(auVar363,auVar37);
    auVar38._4_4_ = local_4e0._4_4_ * local_4e0._4_4_;
    auVar38._0_4_ = local_4e0._0_4_ * local_4e0._0_4_;
    auVar38._8_4_ = local_4e0._8_4_ * local_4e0._8_4_;
    auVar38._12_4_ = local_4e0._12_4_ * local_4e0._12_4_;
    auVar38._16_4_ = local_4e0._16_4_ * local_4e0._16_4_;
    auVar38._20_4_ = local_4e0._20_4_ * local_4e0._20_4_;
    auVar38._24_4_ = local_4e0._24_4_ * local_4e0._24_4_;
    auVar38._28_4_ = fStack_7c4;
    auVar20 = vsubps_avx(auVar383,auVar38);
    local_560 = vsqrtps_avx(auVar110);
    fVar182 = (local_560._0_4_ + auVar210._0_4_) * 1.0000002;
    fVar154 = (local_560._4_4_ + auVar210._4_4_) * 1.0000002;
    fVar156 = (local_560._8_4_ + auVar210._8_4_) * 1.0000002;
    fVar158 = (local_560._12_4_ + auVar210._12_4_) * 1.0000002;
    fVar159 = (local_560._16_4_ + auVar210._16_4_) * 1.0000002;
    fVar160 = (local_560._20_4_ + auVar210._20_4_) * 1.0000002;
    fVar161 = (local_560._24_4_ + auVar210._24_4_) * 1.0000002;
    auVar39._4_4_ = fVar154 * fVar154;
    auVar39._0_4_ = fVar182 * fVar182;
    auVar39._8_4_ = fVar156 * fVar156;
    auVar39._12_4_ = fVar158 * fVar158;
    auVar39._16_4_ = fVar159 * fVar159;
    auVar39._20_4_ = fVar160 * fVar160;
    auVar39._24_4_ = fVar161 * fVar161;
    auVar39._28_4_ = local_560._28_4_ + auVar210._28_4_;
    fVar379 = auVar19._0_4_ + auVar19._0_4_;
    fVar388 = auVar19._4_4_ + auVar19._4_4_;
    local_5e0._0_8_ = CONCAT44(fVar388,fVar379);
    local_5e0._8_4_ = auVar19._8_4_ + auVar19._8_4_;
    local_5e0._12_4_ = auVar19._12_4_ + auVar19._12_4_;
    local_5e0._16_4_ = auVar19._16_4_ + auVar19._16_4_;
    local_5e0._20_4_ = auVar19._20_4_ + auVar19._20_4_;
    local_5e0._24_4_ = auVar19._24_4_ + auVar19._24_4_;
    fVar182 = auVar19._28_4_;
    local_5e0._28_4_ = fVar182 + fVar182;
    auVar386 = ZEXT3264(local_5e0);
    auVar210 = vsubps_avx(auVar20,auVar39);
    local_2a0._4_4_ = fVar398 * fVar398;
    local_2a0._0_4_ = fVar396 * fVar396;
    local_2a0._8_4_ = fVar399 * fVar399;
    local_2a0._12_4_ = fVar400 * fVar400;
    local_2a0._16_4_ = fVar401 * fVar401;
    local_2a0._20_4_ = fVar402 * fVar402;
    local_2a0._24_4_ = fVar403 * fVar403;
    local_2a0._28_4_ = local_5c0._28_4_;
    auVar358 = ZEXT3264(local_2a0);
    local_6a0 = vsubps_avx(local_240,local_2a0);
    auVar40._4_4_ = fVar388 * fVar388;
    auVar40._0_4_ = fVar379 * fVar379;
    auVar40._8_4_ = local_5e0._8_4_ * local_5e0._8_4_;
    auVar40._12_4_ = local_5e0._12_4_ * local_5e0._12_4_;
    auVar40._16_4_ = local_5e0._16_4_ * local_5e0._16_4_;
    auVar40._20_4_ = local_5e0._20_4_ * local_5e0._20_4_;
    auVar40._24_4_ = local_5e0._24_4_ * local_5e0._24_4_;
    auVar40._28_4_ = fVar182;
    fVar154 = local_6a0._0_4_;
    local_660._0_4_ = fVar154 * 4.0;
    fVar156 = local_6a0._4_4_;
    local_660._4_4_ = fVar156 * 4.0;
    fVar158 = local_6a0._8_4_;
    fStack_658 = fVar158 * 4.0;
    fVar159 = local_6a0._12_4_;
    fStack_654 = fVar159 * 4.0;
    fVar160 = local_6a0._16_4_;
    fStack_650 = fVar160 * 4.0;
    fVar161 = local_6a0._20_4_;
    fStack_64c = fVar161 * 4.0;
    fVar348 = local_6a0._24_4_;
    fStack_648 = fVar348 * 4.0;
    fStack_644 = 4.0;
    auVar41._4_4_ = (float)local_660._4_4_ * auVar210._4_4_;
    auVar41._0_4_ = (float)local_660._0_4_ * auVar210._0_4_;
    auVar41._8_4_ = fStack_658 * auVar210._8_4_;
    auVar41._12_4_ = fStack_654 * auVar210._12_4_;
    auVar41._16_4_ = fStack_650 * auVar210._16_4_;
    auVar41._20_4_ = fStack_64c * auVar210._20_4_;
    auVar41._24_4_ = fStack_648 * auVar210._24_4_;
    auVar41._28_4_ = 0x40800000;
    auVar19 = vsubps_avx(auVar40,auVar41);
    auVar365 = ZEXT3264(auVar19);
    auVar110 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,5);
    fVar182 = local_6a0._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar193._8_4_ = 0x7f800000;
      auVar193._0_8_ = 0x7f8000007f800000;
      auVar193._12_4_ = 0x7f800000;
      auVar193._16_4_ = 0x7f800000;
      auVar193._20_4_ = 0x7f800000;
      auVar193._24_4_ = 0x7f800000;
      auVar193._28_4_ = 0x7f800000;
      auVar394._8_4_ = 0xff800000;
      auVar394._0_8_ = 0xff800000ff800000;
      auVar394._12_4_ = 0xff800000;
      auVar394._16_4_ = 0xff800000;
      auVar394._20_4_ = 0xff800000;
      auVar394._24_4_ = 0xff800000;
      auVar394._28_4_ = 0xff800000;
    }
    else {
      auVar23 = vsqrtps_avx(auVar19);
      auVar246._0_4_ = fVar154 + fVar154;
      auVar246._4_4_ = fVar156 + fVar156;
      auVar246._8_4_ = fVar158 + fVar158;
      auVar246._12_4_ = fVar159 + fVar159;
      auVar246._16_4_ = fVar160 + fVar160;
      auVar246._20_4_ = fVar161 + fVar161;
      auVar246._24_4_ = fVar348 + fVar348;
      auVar246._28_4_ = fVar182 + fVar182;
      auVar22 = vrcpps_avx(auVar246);
      auVar21 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,5);
      auVar365 = ZEXT3264(auVar21);
      fVar242 = auVar22._0_4_;
      fVar252 = auVar22._4_4_;
      auVar42._4_4_ = auVar246._4_4_ * fVar252;
      auVar42._0_4_ = auVar246._0_4_ * fVar242;
      fVar255 = auVar22._8_4_;
      auVar42._8_4_ = auVar246._8_4_ * fVar255;
      fVar258 = auVar22._12_4_;
      auVar42._12_4_ = auVar246._12_4_ * fVar258;
      fVar260 = auVar22._16_4_;
      auVar42._16_4_ = auVar246._16_4_ * fVar260;
      fVar262 = auVar22._20_4_;
      auVar42._20_4_ = auVar246._20_4_ * fVar262;
      fVar264 = auVar22._24_4_;
      auVar42._24_4_ = auVar246._24_4_ * fVar264;
      auVar42._28_4_ = auVar246._28_4_;
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = &DAT_3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar291,auVar42);
      fVar242 = fVar242 + fVar242 * auVar19._0_4_;
      fVar252 = fVar252 + fVar252 * auVar19._4_4_;
      fVar255 = fVar255 + fVar255 * auVar19._8_4_;
      fVar258 = fVar258 + fVar258 * auVar19._12_4_;
      fVar260 = fVar260 + fVar260 * auVar19._16_4_;
      fVar262 = fVar262 + fVar262 * auVar19._20_4_;
      fVar264 = fVar264 + fVar264 * auVar19._24_4_;
      auVar269._0_8_ = CONCAT44(fVar388,fVar379) ^ 0x8000000080000000;
      auVar269._8_4_ = -local_5e0._8_4_;
      auVar269._12_4_ = -local_5e0._12_4_;
      auVar269._16_4_ = -local_5e0._16_4_;
      auVar269._20_4_ = -local_5e0._20_4_;
      auVar269._24_4_ = -local_5e0._24_4_;
      auVar269._28_4_ = -local_5e0._28_4_;
      auVar24 = vsubps_avx(auVar269,auVar23);
      fVar379 = auVar24._0_4_ * fVar242;
      fVar388 = auVar24._4_4_ * fVar252;
      auVar43._4_4_ = fVar388;
      auVar43._0_4_ = fVar379;
      fVar277 = auVar24._8_4_ * fVar255;
      auVar43._8_4_ = fVar277;
      fVar279 = auVar24._12_4_ * fVar258;
      auVar43._12_4_ = fVar279;
      fVar281 = auVar24._16_4_ * fVar260;
      auVar43._16_4_ = fVar281;
      fVar283 = auVar24._20_4_ * fVar262;
      auVar43._20_4_ = fVar283;
      fVar285 = auVar24._24_4_ * fVar264;
      auVar43._24_4_ = fVar285;
      auVar43._28_4_ = auVar24._28_4_;
      auVar23 = vsubps_avx(auVar23,local_5e0);
      fVar242 = auVar23._0_4_ * fVar242;
      fVar252 = auVar23._4_4_ * fVar252;
      auVar44._4_4_ = fVar252;
      auVar44._0_4_ = fVar242;
      fVar255 = auVar23._8_4_ * fVar255;
      auVar44._8_4_ = fVar255;
      fVar258 = auVar23._12_4_ * fVar258;
      auVar44._12_4_ = fVar258;
      fVar260 = auVar23._16_4_ * fVar260;
      auVar44._16_4_ = fVar260;
      fVar262 = auVar23._20_4_ * fVar262;
      auVar44._20_4_ = fVar262;
      fVar264 = auVar23._24_4_ * fVar264;
      auVar44._24_4_ = fVar264;
      auVar44._28_4_ = auVar23._28_4_;
      fStack_504 = local_4e0._28_4_ + auVar22._28_4_ + auVar19._28_4_;
      local_520[0] = fVar250 * (local_4e0._0_4_ + fVar396 * fVar379);
      local_520[1] = fVar219 * (local_4e0._4_4_ + fVar398 * fVar388);
      local_520[2] = fVar316 * (local_4e0._8_4_ + fVar399 * fVar277);
      local_520[3] = fVar359 * (local_4e0._12_4_ + fVar400 * fVar279);
      fStack_510 = fVar378 * (local_4e0._16_4_ + fVar401 * fVar281);
      fStack_50c = fVar238 * (local_4e0._20_4_ + fVar402 * fVar283);
      fStack_508 = fVar239 * (local_4e0._24_4_ + fVar403 * fVar285);
      local_540[0] = fVar250 * (local_4e0._0_4_ + fVar396 * fVar242);
      local_540[1] = fVar219 * (local_4e0._4_4_ + fVar398 * fVar252);
      local_540[2] = fVar316 * (local_4e0._8_4_ + fVar399 * fVar255);
      local_540[3] = fVar359 * (local_4e0._12_4_ + fVar400 * fVar258);
      fStack_530 = fVar378 * (local_4e0._16_4_ + fVar401 * fVar260);
      fStack_52c = fVar238 * (local_4e0._20_4_ + fVar402 * fVar262);
      fStack_528 = fVar239 * (local_4e0._24_4_ + fVar403 * fVar264);
      fStack_524 = local_4e0._28_4_ + fStack_504;
      auVar247._8_4_ = 0x7f800000;
      auVar247._0_8_ = 0x7f8000007f800000;
      auVar247._12_4_ = 0x7f800000;
      auVar247._16_4_ = 0x7f800000;
      auVar247._20_4_ = 0x7f800000;
      auVar247._24_4_ = 0x7f800000;
      auVar247._28_4_ = 0x7f800000;
      auVar193 = vblendvps_avx(auVar247,auVar43,auVar21);
      auVar270._8_4_ = 0x7fffffff;
      auVar270._0_8_ = 0x7fffffff7fffffff;
      auVar270._12_4_ = 0x7fffffff;
      auVar270._16_4_ = 0x7fffffff;
      auVar270._20_4_ = 0x7fffffff;
      auVar270._24_4_ = 0x7fffffff;
      auVar270._28_4_ = 0x7fffffff;
      auVar19 = vandps_avx(local_2a0,auVar270);
      auVar19 = vmaxps_avx(local_4c0,auVar19);
      auVar296 = ZEXT3264(CONCAT428(0x36000000,
                                    CONCAT424(0x36000000,
                                              CONCAT420(0x36000000,
                                                        CONCAT416(0x36000000,
                                                                  CONCAT412(0x36000000,
                                                                            CONCAT48(0x36000000,
                                                                                                                                                                          
                                                  0x3600000036000000)))))));
      auVar45._4_4_ = auVar19._4_4_ * 1.9073486e-06;
      auVar45._0_4_ = auVar19._0_4_ * 1.9073486e-06;
      auVar45._8_4_ = auVar19._8_4_ * 1.9073486e-06;
      auVar45._12_4_ = auVar19._12_4_ * 1.9073486e-06;
      auVar45._16_4_ = auVar19._16_4_ * 1.9073486e-06;
      auVar45._20_4_ = auVar19._20_4_ * 1.9073486e-06;
      auVar45._24_4_ = auVar19._24_4_ * 1.9073486e-06;
      auVar45._28_4_ = auVar19._28_4_;
      auVar19 = vandps_avx(local_6a0,auVar270);
      auVar19 = vcmpps_avx(auVar19,auVar45,1);
      auVar386 = ZEXT3264(auVar19);
      auVar248._8_4_ = 0xff800000;
      auVar248._0_8_ = 0xff800000ff800000;
      auVar248._12_4_ = 0xff800000;
      auVar248._16_4_ = 0xff800000;
      auVar248._20_4_ = 0xff800000;
      auVar248._24_4_ = 0xff800000;
      auVar248._28_4_ = 0xff800000;
      auVar394 = vblendvps_avx(auVar248,auVar44,auVar21);
      auVar22 = auVar21 & auVar19;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0x7f,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0xbf,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar22[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar19,auVar21);
        auVar126 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar19 = vcmpps_avx(auVar210,ZEXT832(0) << 0x20,2);
        auVar294._8_4_ = 0xff800000;
        auVar294._0_8_ = 0xff800000ff800000;
        auVar294._12_4_ = 0xff800000;
        auVar294._16_4_ = 0xff800000;
        auVar294._20_4_ = 0xff800000;
        auVar294._24_4_ = 0xff800000;
        auVar294._28_4_ = 0xff800000;
        auVar296 = ZEXT3264(auVar294);
        auVar385._8_4_ = 0x7f800000;
        auVar385._0_8_ = 0x7f8000007f800000;
        auVar385._12_4_ = 0x7f800000;
        auVar385._16_4_ = 0x7f800000;
        auVar385._20_4_ = 0x7f800000;
        auVar385._24_4_ = 0x7f800000;
        auVar385._28_4_ = 0x7f800000;
        auVar386 = ZEXT3264(auVar385);
        auVar210 = vblendvps_avx(auVar385,auVar294,auVar19);
        auVar185 = vpmovsxwd_avx(auVar126);
        auVar126 = vpunpckhwd_avx(auVar126,auVar126);
        auVar234._16_16_ = auVar126;
        auVar234._0_16_ = auVar185;
        auVar193 = vblendvps_avx(auVar193,auVar210,auVar234);
        auVar210 = vblendvps_avx(auVar294,auVar385,auVar19);
        auVar394 = vblendvps_avx(auVar394,auVar210,auVar234);
        auVar210 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar151._0_4_ = auVar110._0_4_ ^ auVar210._0_4_;
        auVar151._4_4_ = auVar110._4_4_ ^ auVar210._4_4_;
        auVar151._8_4_ = auVar110._8_4_ ^ auVar210._8_4_;
        auVar151._12_4_ = auVar110._12_4_ ^ auVar210._12_4_;
        auVar151._16_4_ = auVar110._16_4_ ^ auVar210._16_4_;
        auVar151._20_4_ = auVar110._20_4_ ^ auVar210._20_4_;
        auVar151._24_4_ = auVar110._24_4_ ^ auVar210._24_4_;
        auVar151._28_4_ = auVar110._28_4_ ^ auVar210._28_4_;
        auVar110 = vorps_avx(auVar19,auVar151);
        auVar110 = vandps_avx(auVar21,auVar110);
      }
    }
    auVar210 = local_4a0 & auVar110;
    auVar249 = ZEXT1664(local_a60);
    if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar210 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar210 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar210 >> 0x7f,0) == '\0') &&
          (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar210 >> 0xbf,0) == '\0') &&
        (auVar210 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar210[0x1f])
    {
LAB_00f4ab64:
      auVar210._8_4_ = 0x3f800000;
      auVar210._0_8_ = &DAT_3f8000003f800000;
      auVar210._12_4_ = 0x3f800000;
      auVar210._16_4_ = 0x3f800000;
      auVar210._20_4_ = 0x3f800000;
      auVar210._24_4_ = 0x3f800000;
      auVar210._28_4_ = 0x3f800000;
      fVar182 = fStack_964;
      fVar235 = fStack_968;
      fVar196 = fStack_96c;
      fVar236 = fStack_970;
      fVar197 = fStack_974;
      fVar237 = fStack_978;
      fVar198 = (float)local_980._4_4_;
      fVar240 = (float)local_980._0_4_;
    }
    else {
      local_280 = auVar111;
      auVar126 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar174._16_16_ = auVar126;
      auVar174._0_16_ = auVar126;
      local_680 = vminps_avx(auVar174,auVar394);
      auVar113._0_4_ =
           (float)local_7c0._0_4_ * fVar265 +
           (float)local_7e0._0_4_ * fVar287 + (float)local_800._0_4_ * fVar361;
      auVar113._4_4_ =
           (float)local_7c0._4_4_ * fVar275 +
           (float)local_7e0._4_4_ * fVar297 + (float)local_800._4_4_ * fVar367;
      auVar113._8_4_ = fStack_7b8 * fVar276 + fStack_7d8 * fVar300 + fStack_7f8 * fVar369;
      auVar113._12_4_ = fStack_7b4 * fVar278 + fStack_7d4 * fVar303 + fStack_7f4 * fVar371;
      auVar113._16_4_ = fStack_7b0 * fVar280 + fStack_7d0 * fVar306 + fStack_7f0 * fVar373;
      auVar113._20_4_ = fStack_7ac * fVar282 + fStack_7cc * fVar309 + fStack_7ec * fVar375;
      auVar113._24_4_ = fStack_7a8 * fVar284 + fStack_7c8 * fVar312 + fStack_7e8 * fVar377;
      auVar113._28_4_ = fVar286 + fVar315 + auVar18._28_4_;
      auVar210 = vrcpps_avx(auVar113);
      fVar286 = auVar210._0_4_;
      fVar379 = auVar210._4_4_;
      auVar46._4_4_ = auVar113._4_4_ * fVar379;
      auVar46._0_4_ = auVar113._0_4_ * fVar286;
      fVar388 = auVar210._8_4_;
      auVar46._8_4_ = auVar113._8_4_ * fVar388;
      fVar242 = auVar210._12_4_;
      auVar46._12_4_ = auVar113._12_4_ * fVar242;
      fVar252 = auVar210._16_4_;
      auVar46._16_4_ = auVar113._16_4_ * fVar252;
      fVar255 = auVar210._20_4_;
      auVar46._20_4_ = auVar113._20_4_ * fVar255;
      fVar258 = auVar210._24_4_;
      auVar46._24_4_ = auVar113._24_4_ * fVar258;
      auVar46._28_4_ = fVar315;
      auVar323._8_4_ = 0x3f800000;
      auVar323._0_8_ = &DAT_3f8000003f800000;
      auVar323._12_4_ = 0x3f800000;
      auVar323._16_4_ = 0x3f800000;
      auVar323._20_4_ = 0x3f800000;
      auVar323._24_4_ = 0x3f800000;
      auVar323._28_4_ = 0x3f800000;
      auVar21 = vsubps_avx(auVar323,auVar46);
      auVar292._8_4_ = 0x7fffffff;
      auVar292._0_8_ = 0x7fffffff7fffffff;
      auVar292._12_4_ = 0x7fffffff;
      auVar292._16_4_ = 0x7fffffff;
      auVar292._20_4_ = 0x7fffffff;
      auVar292._24_4_ = 0x7fffffff;
      auVar292._28_4_ = 0x7fffffff;
      auVar210 = vandps_avx(auVar292,auVar113);
      auVar384._8_4_ = 0x219392ef;
      auVar384._0_8_ = 0x219392ef219392ef;
      auVar384._12_4_ = 0x219392ef;
      auVar384._16_4_ = 0x219392ef;
      auVar384._20_4_ = 0x219392ef;
      auVar384._24_4_ = 0x219392ef;
      auVar384._28_4_ = 0x219392ef;
      auVar386 = ZEXT3264(auVar384);
      auVar19 = vcmpps_avx(auVar210,auVar384,1);
      auVar354 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar47._4_4_ =
           (fVar379 + fVar379 * auVar21._4_4_) *
           -(fVar275 * fVar299 + fVar297 * fVar218 + fVar367 * fVar217);
      auVar47._0_4_ =
           (fVar286 + fVar286 * auVar21._0_4_) *
           -(fVar265 * fVar289 + fVar287 * fVar240 + fVar361 * fVar198);
      auVar47._8_4_ =
           (fVar388 + fVar388 * auVar21._8_4_) *
           -(fVar276 * fVar302 + fVar300 * fVar263 + fVar369 * fVar261);
      auVar47._12_4_ =
           (fVar242 + fVar242 * auVar21._12_4_) *
           -(fVar278 * fVar305 + fVar303 * fVar355 + fVar371 * fVar344);
      auVar47._16_4_ =
           (fVar252 + fVar252 * auVar21._16_4_) *
           -(fVar280 * fVar308 + fVar306 * fVar376 + fVar373 * fVar374);
      auVar47._20_4_ =
           (fVar255 + fVar255 * auVar21._20_4_) *
           -(fVar282 * fVar311 + fVar309 * fVar7 + fVar375 * fVar393);
      auVar47._24_4_ =
           (fVar258 + fVar258 * auVar21._24_4_) *
           -(fVar284 * fVar314 + fVar312 * fVar14 + fVar377 * fVar13);
      auVar47._28_4_ = -(auVar18._28_4_ + auVar193._28_4_ + local_680._28_4_);
      auVar210 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,1);
      auVar210 = vorps_avx(auVar19,auVar210);
      auVar357._8_4_ = 0xff800000;
      auVar357._0_8_ = 0xff800000ff800000;
      auVar357._12_4_ = 0xff800000;
      auVar357._16_4_ = 0xff800000;
      auVar357._20_4_ = 0xff800000;
      auVar357._24_4_ = 0xff800000;
      auVar357._28_4_ = 0xff800000;
      auVar358 = ZEXT3264(auVar357);
      auVar210 = vblendvps_avx(auVar47,auVar357,auVar210);
      auVar18 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,6);
      auVar18 = vorps_avx(auVar19,auVar18);
      auVar364._8_4_ = 0x7f800000;
      auVar364._0_8_ = 0x7f8000007f800000;
      auVar364._12_4_ = 0x7f800000;
      auVar364._16_4_ = 0x7f800000;
      auVar364._20_4_ = 0x7f800000;
      auVar364._24_4_ = 0x7f800000;
      auVar364._28_4_ = 0x7f800000;
      auVar365 = ZEXT3264(auVar364);
      auVar18 = vblendvps_avx(auVar47,auVar364,auVar18);
      auVar19 = vmaxps_avx(local_260,auVar193);
      auVar19 = vmaxps_avx(auVar19,auVar210);
      auVar21 = vminps_avx(local_680,auVar18);
      auVar296 = ZEXT3264(auVar21);
      auVar271 = ZEXT832(0) << 0x20;
      auVar210 = vsubps_avx(auVar271,local_9c0);
      auVar18 = vsubps_avx(auVar271,_local_9e0);
      auVar48._4_4_ = auVar18._4_4_ * -fVar298;
      auVar48._0_4_ = auVar18._0_4_ * -fVar288;
      auVar48._8_4_ = auVar18._8_4_ * -fVar301;
      auVar48._12_4_ = auVar18._12_4_ * -fVar304;
      auVar48._16_4_ = auVar18._16_4_ * -fVar307;
      auVar48._20_4_ = auVar18._20_4_ * -fVar310;
      auVar48._24_4_ = auVar18._24_4_ * -fVar313;
      auVar48._28_4_ = auVar18._28_4_;
      auVar49._4_4_ = fVar215 * auVar210._4_4_;
      auVar49._0_4_ = fVar197 * auVar210._0_4_;
      auVar49._8_4_ = fVar257 * auVar210._8_4_;
      auVar49._12_4_ = fVar336 * auVar210._12_4_;
      auVar49._16_4_ = fVar370 * auVar210._16_4_;
      auVar49._20_4_ = fVar391 * auVar210._20_4_;
      auVar49._24_4_ = fVar11 * auVar210._24_4_;
      auVar49._28_4_ = auVar210._28_4_;
      auVar210 = vsubps_avx(auVar48,auVar49);
      auVar16 = vsubps_avx(auVar271,auVar16);
      auVar50._4_4_ = fVar216 * auVar16._4_4_;
      auVar50._0_4_ = fVar237 * auVar16._0_4_;
      auVar50._8_4_ = fVar259 * auVar16._8_4_;
      auVar50._12_4_ = fVar340 * auVar16._12_4_;
      auVar50._16_4_ = fVar372 * auVar16._16_4_;
      auVar50._20_4_ = fVar392 * auVar16._20_4_;
      uVar1 = auVar16._28_4_;
      auVar50._24_4_ = fVar12 * auVar16._24_4_;
      auVar50._28_4_ = uVar1;
      auVar22 = vsubps_avx(auVar210,auVar50);
      auVar51._4_4_ = (float)local_800._4_4_ * -fVar298;
      auVar51._0_4_ = (float)local_800._0_4_ * -fVar288;
      auVar51._8_4_ = fStack_7f8 * -fVar301;
      auVar51._12_4_ = fStack_7f4 * -fVar304;
      auVar51._16_4_ = fStack_7f0 * -fVar307;
      auVar51._20_4_ = fStack_7ec * -fVar310;
      auVar51._24_4_ = fStack_7e8 * -fVar313;
      auVar51._28_4_ = local_ac0._28_4_ ^ 0x80000000;
      auVar52._4_4_ = (float)local_7e0._4_4_ * fVar215;
      auVar52._0_4_ = (float)local_7e0._0_4_ * fVar197;
      auVar52._8_4_ = fStack_7d8 * fVar257;
      auVar52._12_4_ = fStack_7d4 * fVar336;
      auVar52._16_4_ = fStack_7d0 * fVar370;
      auVar52._20_4_ = fStack_7cc * fVar391;
      auVar52._24_4_ = fStack_7c8 * fVar11;
      auVar52._28_4_ = uVar1;
      auVar16 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar216 * (float)local_7c0._4_4_;
      auVar53._0_4_ = fVar237 * (float)local_7c0._0_4_;
      auVar53._8_4_ = fVar259 * fStack_7b8;
      auVar53._12_4_ = fVar340 * fStack_7b4;
      auVar53._16_4_ = fVar372 * fStack_7b0;
      auVar53._20_4_ = fVar392 * fStack_7ac;
      auVar53._24_4_ = fVar12 * fStack_7a8;
      auVar53._28_4_ = uVar1;
      auVar210._8_4_ = 0x3f800000;
      auVar210._0_8_ = &DAT_3f8000003f800000;
      auVar210._12_4_ = 0x3f800000;
      auVar210._16_4_ = 0x3f800000;
      auVar210._20_4_ = 0x3f800000;
      auVar210._24_4_ = 0x3f800000;
      auVar210._28_4_ = 0x3f800000;
      auVar23 = vsubps_avx(auVar16,auVar53);
      auVar16 = vrcpps_avx(auVar23);
      fVar197 = auVar16._0_4_;
      fVar237 = auVar16._4_4_;
      auVar54._4_4_ = auVar23._4_4_ * fVar237;
      auVar54._0_4_ = auVar23._0_4_ * fVar197;
      fVar198 = auVar16._8_4_;
      auVar54._8_4_ = auVar23._8_4_ * fVar198;
      fVar240 = auVar16._12_4_;
      auVar54._12_4_ = auVar23._12_4_ * fVar240;
      fVar215 = auVar16._16_4_;
      auVar54._16_4_ = auVar23._16_4_ * fVar215;
      fVar216 = auVar16._20_4_;
      auVar54._20_4_ = auVar23._20_4_ * fVar216;
      fVar217 = auVar16._24_4_;
      auVar54._24_4_ = auVar23._24_4_ * fVar217;
      auVar54._28_4_ = fStack_7a4;
      auVar24 = vsubps_avx(auVar210,auVar54);
      auVar114._8_4_ = 0x7fffffff;
      auVar114._0_8_ = 0x7fffffff7fffffff;
      auVar114._12_4_ = 0x7fffffff;
      auVar114._16_4_ = 0x7fffffff;
      auVar114._20_4_ = 0x7fffffff;
      auVar114._24_4_ = 0x7fffffff;
      auVar114._28_4_ = 0x7fffffff;
      auVar16 = vandps_avx(auVar23,auVar114);
      auVar18 = vcmpps_avx(auVar16,auVar384,1);
      auVar55._4_4_ = (fVar237 + fVar237 * auVar24._4_4_) * -auVar22._4_4_;
      auVar55._0_4_ = (fVar197 + fVar197 * auVar24._0_4_) * -auVar22._0_4_;
      auVar55._8_4_ = (fVar198 + fVar198 * auVar24._8_4_) * -auVar22._8_4_;
      auVar55._12_4_ = (fVar240 + fVar240 * auVar24._12_4_) * -auVar22._12_4_;
      auVar55._16_4_ = (fVar215 + fVar215 * auVar24._16_4_) * -auVar22._16_4_;
      auVar55._20_4_ = (fVar216 + fVar216 * auVar24._20_4_) * -auVar22._20_4_;
      auVar55._24_4_ = (fVar217 + fVar217 * auVar24._24_4_) * -auVar22._24_4_;
      auVar55._28_4_ = auVar22._28_4_ ^ 0x80000000;
      auVar16 = vcmpps_avx(auVar23,auVar271,1);
      auVar16 = vorps_avx(auVar18,auVar16);
      auVar16 = vblendvps_avx(auVar55,auVar357,auVar16);
      local_680 = vmaxps_avx(auVar19,auVar16);
      auVar16 = vcmpps_avx(auVar23,ZEXT832(0) << 0x20,6);
      auVar16 = vorps_avx(auVar18,auVar16);
      auVar16 = vblendvps_avx(auVar55,auVar364,auVar16);
      auVar110 = vandps_avx(auVar110,local_4a0);
      local_2c0 = vminps_avx(auVar21,auVar16);
      auVar16 = vcmpps_avx(local_680,local_2c0,2);
      auVar18 = auVar110 & auVar16;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar18 = vminps_avx(local_7a0,auVar139);
        auVar17 = vminps_avx(local_640,auVar17);
        auVar17 = vminps_avx(auVar18,auVar17);
        auVar17 = vsubps_avx(auVar17,local_560);
        auVar110 = vandps_avx(auVar16,auVar110);
        auVar87._4_4_ = local_520[1];
        auVar87._0_4_ = local_520[0];
        auVar87._8_4_ = local_520[2];
        auVar87._12_4_ = local_520[3];
        auVar87._16_4_ = fStack_510;
        auVar87._20_4_ = fStack_50c;
        auVar87._24_4_ = fStack_508;
        auVar87._28_4_ = fStack_504;
        auVar16 = vminps_avx(auVar87,auVar210);
        auVar16 = vmaxps_avx(auVar16,ZEXT832(0) << 0x20);
        local_520[0] = fVar95 + fVar123 * (auVar16._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar120 + fVar153 * (auVar16._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar121 + fVar155 * (auVar16._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar122 + fVar157 * (auVar16._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar95 + fVar123 * (auVar16._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar120 + fVar153 * (auVar16._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar121 + fVar155 * (auVar16._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar122 + auVar16._28_4_ + 7.0;
        auVar86._4_4_ = local_540[1];
        auVar86._0_4_ = local_540[0];
        auVar86._8_4_ = local_540[2];
        auVar86._12_4_ = local_540[3];
        auVar86._16_4_ = fStack_530;
        auVar86._20_4_ = fStack_52c;
        auVar86._24_4_ = fStack_528;
        auVar86._28_4_ = fStack_524;
        auVar16 = vminps_avx(auVar86,auVar210);
        auVar16 = vmaxps_avx(auVar16,ZEXT832(0) << 0x20);
        local_540[0] = fVar95 + fVar123 * (auVar16._0_4_ + 0.0) * 0.125;
        local_540[1] = fVar120 + fVar153 * (auVar16._4_4_ + 1.0) * 0.125;
        local_540[2] = fVar121 + fVar155 * (auVar16._8_4_ + 2.0) * 0.125;
        local_540[3] = fVar122 + fVar157 * (auVar16._12_4_ + 3.0) * 0.125;
        fStack_530 = fVar95 + fVar123 * (auVar16._16_4_ + 4.0) * 0.125;
        fStack_52c = fVar120 + fVar153 * (auVar16._20_4_ + 5.0) * 0.125;
        fStack_528 = fVar121 + fVar155 * (auVar16._24_4_ + 6.0) * 0.125;
        fStack_524 = fVar122 + auVar16._28_4_ + 7.0;
        auVar56._4_4_ = auVar17._4_4_ * 0.99999976;
        auVar56._0_4_ = auVar17._0_4_ * 0.99999976;
        auVar56._8_4_ = auVar17._8_4_ * 0.99999976;
        auVar56._12_4_ = auVar17._12_4_ * 0.99999976;
        auVar56._16_4_ = auVar17._16_4_ * 0.99999976;
        auVar56._20_4_ = auVar17._20_4_ * 0.99999976;
        auVar56._24_4_ = auVar17._24_4_ * 0.99999976;
        auVar56._28_4_ = 0x3f7ffffc;
        auVar16 = vmaxps_avx(ZEXT832(0) << 0x20,auVar56);
        auVar57._4_4_ = auVar16._4_4_ * auVar16._4_4_;
        auVar57._0_4_ = auVar16._0_4_ * auVar16._0_4_;
        auVar57._8_4_ = auVar16._8_4_ * auVar16._8_4_;
        auVar57._12_4_ = auVar16._12_4_ * auVar16._12_4_;
        auVar57._16_4_ = auVar16._16_4_ * auVar16._16_4_;
        auVar57._20_4_ = auVar16._20_4_ * auVar16._20_4_;
        auVar57._24_4_ = auVar16._24_4_ * auVar16._24_4_;
        auVar57._28_4_ = auVar16._28_4_;
        auVar17 = vsubps_avx(auVar20,auVar57);
        auVar58._4_4_ = auVar17._4_4_ * (float)local_660._4_4_;
        auVar58._0_4_ = auVar17._0_4_ * (float)local_660._0_4_;
        auVar58._8_4_ = auVar17._8_4_ * fStack_658;
        auVar58._12_4_ = auVar17._12_4_ * fStack_654;
        auVar58._16_4_ = auVar17._16_4_ * fStack_650;
        auVar58._20_4_ = auVar17._20_4_ * fStack_64c;
        auVar58._24_4_ = auVar17._24_4_ * fStack_648;
        auVar58._28_4_ = auVar16._28_4_;
        auVar18 = vsubps_avx(auVar40,auVar58);
        local_a80 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
        auVar16 = local_a80;
        if ((((((((local_a80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a80 >> 0x7f,0) == '\0') &&
              (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a80 >> 0xbf,0) == '\0') &&
            (local_a80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a80[0x1f]) {
          _local_8a0 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          auVar190 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar209 = ZEXT828(0) << 0x20;
          auVar322 = ZEXT828(0) << 0x20;
          auVar175._8_4_ = 0x7f800000;
          auVar175._0_8_ = 0x7f8000007f800000;
          auVar175._12_4_ = 0x7f800000;
          auVar175._16_4_ = 0x7f800000;
          auVar175._20_4_ = 0x7f800000;
          auVar175._24_4_ = 0x7f800000;
          auVar175._28_4_ = 0x7f800000;
          auVar228._8_4_ = 0xff800000;
          auVar228._0_8_ = 0xff800000ff800000;
          auVar228._12_4_ = 0xff800000;
          auVar228._16_4_ = 0xff800000;
          auVar228._20_4_ = 0xff800000;
          auVar228._24_4_ = 0xff800000;
          auVar228._28_4_ = 0xff800000;
          auVar353 = local_960;
          local_a80 = auVar25;
          _local_880 = _local_8a0;
        }
        else {
          auVar20 = vsqrtps_avx(auVar18);
          auVar211._0_4_ = fVar154 + fVar154;
          auVar211._4_4_ = fVar156 + fVar156;
          auVar211._8_4_ = fVar158 + fVar158;
          auVar211._12_4_ = fVar159 + fVar159;
          auVar211._16_4_ = fVar160 + fVar160;
          auVar211._20_4_ = fVar161 + fVar161;
          auVar211._24_4_ = fVar348 + fVar348;
          auVar211._28_4_ = fVar182 + fVar182;
          auVar19 = vrcpps_avx(auVar211);
          fVar182 = auVar19._0_4_;
          fVar197 = auVar19._4_4_;
          auVar59._4_4_ = auVar211._4_4_ * fVar197;
          auVar59._0_4_ = auVar211._0_4_ * fVar182;
          fVar237 = auVar19._8_4_;
          auVar59._8_4_ = auVar211._8_4_ * fVar237;
          fVar198 = auVar19._12_4_;
          auVar59._12_4_ = auVar211._12_4_ * fVar198;
          fVar240 = auVar19._16_4_;
          auVar59._16_4_ = auVar211._16_4_ * fVar240;
          fVar215 = auVar19._20_4_;
          auVar59._20_4_ = auVar211._20_4_ * fVar215;
          fVar216 = auVar19._24_4_;
          auVar59._24_4_ = auVar211._24_4_ * fVar216;
          auVar59._28_4_ = auVar211._28_4_;
          auVar210 = vsubps_avx(auVar210,auVar59);
          fVar182 = fVar182 + fVar182 * auVar210._0_4_;
          fVar197 = fVar197 + fVar197 * auVar210._4_4_;
          fVar237 = fVar237 + fVar237 * auVar210._8_4_;
          fVar198 = fVar198 + fVar198 * auVar210._12_4_;
          fVar240 = fVar240 + fVar240 * auVar210._16_4_;
          fVar215 = fVar215 + fVar215 * auVar210._20_4_;
          fVar216 = fVar216 + fVar216 * auVar210._24_4_;
          fVar217 = auVar19._28_4_ + auVar210._28_4_;
          auVar229._0_8_ = local_5e0._0_8_ ^ 0x8000000080000000;
          auVar229._8_4_ = -local_5e0._8_4_;
          auVar229._12_4_ = -local_5e0._12_4_;
          auVar229._16_4_ = -local_5e0._16_4_;
          auVar229._20_4_ = -local_5e0._20_4_;
          auVar229._24_4_ = -local_5e0._24_4_;
          auVar229._28_4_ = -local_5e0._28_4_;
          auVar210 = vsubps_avx(auVar229,auVar20);
          fVar344 = auVar210._0_4_ * fVar182;
          fVar355 = auVar210._4_4_ * fVar197;
          auVar60._4_4_ = fVar355;
          auVar60._0_4_ = fVar344;
          fVar370 = auVar210._8_4_ * fVar237;
          auVar60._8_4_ = fVar370;
          fVar372 = auVar210._12_4_ * fVar198;
          auVar60._12_4_ = fVar372;
          fVar374 = auVar210._16_4_ * fVar240;
          auVar60._16_4_ = fVar374;
          fVar376 = auVar210._20_4_ * fVar215;
          auVar60._20_4_ = fVar376;
          fVar391 = auVar210._24_4_ * fVar216;
          auVar60._24_4_ = fVar391;
          auVar60._28_4_ = 0x219392ef;
          auVar386 = ZEXT3264(auVar60);
          auVar19 = vsubps_avx(auVar20,local_5e0);
          fVar182 = auVar19._0_4_ * fVar182;
          fVar197 = auVar19._4_4_ * fVar197;
          auVar61._4_4_ = fVar197;
          auVar61._0_4_ = fVar182;
          fVar237 = auVar19._8_4_ * fVar237;
          auVar61._8_4_ = fVar237;
          fVar198 = auVar19._12_4_ * fVar198;
          auVar61._12_4_ = fVar198;
          fVar240 = auVar19._16_4_ * fVar240;
          auVar61._16_4_ = fVar240;
          fVar215 = auVar19._20_4_ * fVar215;
          auVar61._20_4_ = fVar215;
          fVar216 = auVar19._24_4_ * fVar216;
          auVar61._24_4_ = fVar216;
          auVar61._28_4_ = 0x7f800000;
          auVar365 = ZEXT3264(auVar61);
          fVar218 = fVar250 * (fVar344 * fVar396 + local_4e0._0_4_);
          fVar257 = fVar219 * (fVar355 * fVar398 + local_4e0._4_4_);
          fVar259 = fVar316 * (fVar370 * fVar399 + local_4e0._8_4_);
          fVar261 = fVar359 * (fVar372 * fVar400 + local_4e0._12_4_);
          fVar263 = fVar378 * (fVar374 * fVar401 + local_4e0._16_4_);
          fVar336 = fVar238 * (fVar376 * fVar402 + local_4e0._20_4_);
          fVar340 = fVar239 * (fVar391 * fVar403 + local_4e0._24_4_);
          auVar194._0_4_ = fVar317 + fVar236 * fVar218;
          auVar194._4_4_ = fVar325 + fVar214 * fVar257;
          auVar194._8_4_ = fVar329 + fVar254 * fVar259;
          auVar194._12_4_ = fVar333 + fVar332 * fVar261;
          auVar194._16_4_ = fVar337 + fVar368 * fVar263;
          auVar194._20_4_ = fVar341 + fVar390 * fVar336;
          auVar194._24_4_ = fVar345 + fVar10 * fVar340;
          auVar194._28_4_ = fVar349 + auVar19._28_4_ + local_4e0._28_4_;
          auVar62._4_4_ = (float)local_7c0._4_4_ * fVar355;
          auVar62._0_4_ = (float)local_7c0._0_4_ * fVar344;
          auVar62._8_4_ = fStack_7b8 * fVar370;
          auVar62._12_4_ = fStack_7b4 * fVar372;
          auVar62._16_4_ = fStack_7b0 * fVar374;
          auVar62._20_4_ = fStack_7ac * fVar376;
          auVar62._24_4_ = fStack_7a8 * fVar391;
          auVar62._28_4_ = fVar217;
          _local_9e0 = vsubps_avx(auVar62,auVar194);
          auVar212._0_4_ = fVar318 + fVar235 * fVar218;
          auVar212._4_4_ = fVar326 + fVar253 * fVar257;
          auVar212._8_4_ = fVar330 + fVar241 * fVar259;
          auVar212._12_4_ = fVar334 + fVar324 * fVar261;
          auVar212._16_4_ = fVar338 + fVar360 * fVar263;
          auVar212._20_4_ = fVar342 + fVar387 * fVar336;
          auVar212._24_4_ = fVar346 + fVar8 * fVar340;
          auVar212._28_4_ = fVar350 + fVar217;
          auVar272._0_4_ = (float)local_7e0._0_4_ * fVar344;
          auVar272._4_4_ = (float)local_7e0._4_4_ * fVar355;
          auVar272._8_4_ = fStack_7d8 * fVar370;
          auVar272._12_4_ = fStack_7d4 * fVar372;
          auVar272._16_4_ = fStack_7d0 * fVar374;
          auVar272._20_4_ = fStack_7cc * fVar376;
          auVar272._24_4_ = fStack_7c8 * fVar391;
          auVar272._28_4_ = 0;
          local_b00 = vsubps_avx(auVar272,auVar212);
          auVar230._0_4_ = fVar319 + fVar196 * fVar218;
          auVar230._4_4_ = fVar327 + fVar256 * fVar257;
          auVar230._8_4_ = fVar331 + fVar251 * fVar259;
          auVar230._12_4_ = fVar335 + fVar328 * fVar261;
          auVar230._16_4_ = fVar339 + fVar366 * fVar263;
          auVar230._20_4_ = fVar343 + fVar389 * fVar336;
          auVar230._24_4_ = fVar347 + fVar9 * fVar340;
          auVar230._28_4_ = fVar351 + auVar210._28_4_;
          auVar63._4_4_ = (float)local_800._4_4_ * fVar355;
          auVar63._0_4_ = (float)local_800._0_4_ * fVar344;
          auVar63._8_4_ = fStack_7f8 * fVar370;
          auVar63._12_4_ = fStack_7f4 * fVar372;
          auVar63._16_4_ = fStack_7f0 * fVar374;
          auVar63._20_4_ = fStack_7ec * fVar376;
          auVar63._24_4_ = fStack_7e8 * fVar391;
          auVar63._28_4_ = 0;
          local_8e0 = vsubps_avx(auVar63,auVar230);
          fVar250 = fVar250 * (fVar182 * fVar396 + local_4e0._0_4_);
          fVar219 = fVar219 * (fVar197 * fVar398 + local_4e0._4_4_);
          fVar316 = fVar316 * (fVar237 * fVar399 + local_4e0._8_4_);
          fVar359 = fVar359 * (fVar198 * fVar400 + local_4e0._12_4_);
          fVar378 = fVar378 * (fVar240 * fVar401 + local_4e0._16_4_);
          fVar238 = fVar238 * (fVar215 * fVar402 + local_4e0._20_4_);
          fVar239 = fVar239 * (fVar216 * fVar403 + local_4e0._24_4_);
          auVar273._0_4_ = fVar317 + fVar236 * fVar250;
          auVar273._4_4_ = fVar325 + fVar214 * fVar219;
          auVar273._8_4_ = fVar329 + fVar254 * fVar316;
          auVar273._12_4_ = fVar333 + fVar332 * fVar359;
          auVar273._16_4_ = fVar337 + fVar368 * fVar378;
          auVar273._20_4_ = fVar341 + fVar390 * fVar238;
          auVar273._24_4_ = fVar345 + fVar10 * fVar239;
          auVar273._28_4_ = fVar349 + 0.0;
          auVar64._4_4_ = (float)local_7c0._4_4_ * fVar197;
          auVar64._0_4_ = (float)local_7c0._0_4_ * fVar182;
          auVar64._8_4_ = fStack_7b8 * fVar237;
          auVar64._12_4_ = fStack_7b4 * fVar198;
          auVar64._16_4_ = fStack_7b0 * fVar240;
          auVar64._20_4_ = fStack_7ac * fVar215;
          auVar64._24_4_ = fStack_7a8 * fVar216;
          auVar64._28_4_ = fStack_7a4;
          _local_880 = vsubps_avx(auVar64,auVar273);
          auVar274._0_4_ = fVar318 + fVar235 * fVar250;
          auVar274._4_4_ = fVar326 + fVar253 * fVar219;
          auVar274._8_4_ = fVar330 + fVar241 * fVar316;
          auVar274._12_4_ = fVar334 + fVar324 * fVar359;
          auVar274._16_4_ = fVar338 + fVar360 * fVar378;
          auVar274._20_4_ = fVar342 + fVar387 * fVar238;
          auVar274._24_4_ = fVar346 + fVar8 * fVar239;
          auVar274._28_4_ = fVar350 + local_880._28_4_;
          auVar65._4_4_ = (float)local_7e0._4_4_ * fVar197;
          auVar65._0_4_ = (float)local_7e0._0_4_ * fVar182;
          auVar65._8_4_ = fStack_7d8 * fVar237;
          auVar65._12_4_ = fStack_7d4 * fVar198;
          auVar65._16_4_ = fStack_7d0 * fVar240;
          auVar65._20_4_ = fStack_7cc * fVar215;
          auVar65._24_4_ = fStack_7c8 * fVar216;
          auVar65._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar65,auVar274);
          auVar231._0_4_ = fVar319 + fVar196 * fVar250;
          auVar231._4_4_ = fVar327 + fVar256 * fVar219;
          auVar231._8_4_ = fVar331 + fVar251 * fVar316;
          auVar231._12_4_ = fVar335 + fVar328 * fVar359;
          auVar231._16_4_ = fVar339 + fVar366 * fVar378;
          auVar231._20_4_ = fVar343 + fVar389 * fVar238;
          auVar231._24_4_ = fVar347 + fVar9 * fVar239;
          auVar231._28_4_ = fVar351 + local_8e0._28_4_ + local_4e0._28_4_;
          auVar66._4_4_ = (float)local_800._4_4_ * fVar197;
          auVar66._0_4_ = (float)local_800._0_4_ * fVar182;
          auVar66._8_4_ = fStack_7f8 * fVar237;
          auVar66._12_4_ = fStack_7f4 * fVar198;
          auVar66._16_4_ = fStack_7f0 * fVar240;
          auVar66._20_4_ = fStack_7ec * fVar215;
          auVar66._24_4_ = fStack_7e8 * fVar216;
          auVar66._28_4_ = local_8a0._28_4_;
          _local_660 = vsubps_avx(auVar66,auVar231);
          auVar18 = vcmpps_avx(auVar18,_DAT_02020f00,5);
          auVar176._8_4_ = 0x7f800000;
          auVar176._0_8_ = 0x7f8000007f800000;
          auVar176._12_4_ = 0x7f800000;
          auVar176._16_4_ = 0x7f800000;
          auVar176._20_4_ = 0x7f800000;
          auVar176._24_4_ = 0x7f800000;
          auVar176._28_4_ = 0x7f800000;
          auVar175 = vblendvps_avx(auVar176,auVar60,auVar18);
          auVar293._8_4_ = 0x7fffffff;
          auVar293._0_8_ = 0x7fffffff7fffffff;
          auVar293._12_4_ = 0x7fffffff;
          auVar293._16_4_ = 0x7fffffff;
          auVar293._20_4_ = 0x7fffffff;
          auVar293._24_4_ = 0x7fffffff;
          auVar293._28_4_ = 0x7fffffff;
          auVar210 = vandps_avx(auVar293,local_2a0);
          auVar210 = vmaxps_avx(local_4c0,auVar210);
          auVar353._8_4_ = 0x36000000;
          auVar353._0_8_ = 0x3600000036000000;
          auVar353._12_4_ = 0x36000000;
          auVar353._16_4_ = 0x36000000;
          auVar353._20_4_ = 0x36000000;
          auVar353._24_4_ = 0x36000000;
          auVar353._28_4_ = 0x36000000;
          auVar67._4_4_ = auVar210._4_4_ * 1.9073486e-06;
          auVar67._0_4_ = auVar210._0_4_ * 1.9073486e-06;
          auVar67._8_4_ = auVar210._8_4_ * 1.9073486e-06;
          auVar67._12_4_ = auVar210._12_4_ * 1.9073486e-06;
          auVar67._16_4_ = auVar210._16_4_ * 1.9073486e-06;
          auVar67._20_4_ = auVar210._20_4_ * 1.9073486e-06;
          auVar67._24_4_ = auVar210._24_4_ * 1.9073486e-06;
          auVar67._28_4_ = auVar210._28_4_;
          auVar210 = vandps_avx(auVar293,local_6a0);
          auVar210 = vcmpps_avx(auVar210,auVar67,1);
          auVar232._8_4_ = 0xff800000;
          auVar232._0_8_ = 0xff800000ff800000;
          auVar232._12_4_ = 0xff800000;
          auVar232._16_4_ = 0xff800000;
          auVar232._20_4_ = 0xff800000;
          auVar232._24_4_ = 0xff800000;
          auVar232._28_4_ = 0xff800000;
          auVar228 = vblendvps_avx(auVar232,auVar61,auVar18);
          auVar19 = auVar18 & auVar210;
          if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0x7f,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar19 >> 0xbf,0) != '\0') ||
              (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar19[0x1f] < '\0') {
            auVar210 = vandps_avx(auVar210,auVar18);
            auVar126 = vpackssdw_avx(auVar210._0_16_,auVar210._16_16_);
            auVar69 = ZEXT412(0);
            auVar386 = ZEXT1264(auVar69) << 0x20;
            auVar353 = vcmpps_avx(auVar17,ZEXT1232(auVar69) << 0x20,2);
            auVar395._8_4_ = 0xff800000;
            auVar395._0_8_ = 0xff800000ff800000;
            auVar395._12_4_ = 0xff800000;
            auVar395._16_4_ = 0xff800000;
            auVar395._20_4_ = 0xff800000;
            auVar395._24_4_ = 0xff800000;
            auVar395._28_4_ = 0xff800000;
            auVar397._8_4_ = 0x7f800000;
            auVar397._0_8_ = 0x7f8000007f800000;
            auVar397._12_4_ = 0x7f800000;
            auVar397._16_4_ = 0x7f800000;
            auVar397._20_4_ = 0x7f800000;
            auVar397._24_4_ = 0x7f800000;
            auVar397._28_4_ = 0x7f800000;
            auVar111 = vblendvps_avx(auVar397,auVar395,auVar353);
            auVar185 = vpmovsxwd_avx(auVar126);
            auVar365 = ZEXT1664(auVar185);
            auVar126 = vpunpckhwd_avx(auVar126,auVar126);
            auVar295._16_16_ = auVar126;
            auVar295._0_16_ = auVar185;
            auVar175 = vblendvps_avx(auVar175,auVar111,auVar295);
            auVar111 = vblendvps_avx(auVar395,auVar397,auVar353);
            auVar228 = vblendvps_avx(auVar228,auVar111,auVar295);
            auVar16 = vcmpps_avx(ZEXT1232(auVar69) << 0x20,ZEXT1232(auVar69) << 0x20,0xf);
            auVar152._0_4_ = auVar16._0_4_ ^ auVar210._0_4_;
            auVar152._4_4_ = auVar16._4_4_ ^ auVar210._4_4_;
            auVar152._8_4_ = auVar16._8_4_ ^ auVar210._8_4_;
            auVar152._12_4_ = auVar16._12_4_ ^ auVar210._12_4_;
            auVar152._16_4_ = auVar16._16_4_ ^ auVar210._16_4_;
            auVar152._20_4_ = auVar16._20_4_ ^ auVar210._20_4_;
            auVar152._24_4_ = auVar16._24_4_ ^ auVar210._24_4_;
            auVar152._28_4_ = auVar16._28_4_ ^ auVar210._28_4_;
            auVar210 = vorps_avx(auVar353,auVar152);
            auVar16 = vandps_avx(auVar18,auVar210);
          }
          auVar358 = ZEXT3264(auVar111);
          auVar190 = local_9e0._0_28_;
          auVar209 = local_b00._0_28_;
          auVar322 = local_8e0._0_28_;
          local_9c0 = auVar110;
        }
        auVar354 = ZEXT3264(auVar353);
        auVar296 = ZEXT3264(local_680);
        _local_320 = local_680;
        local_300 = vminps_avx(local_2c0,auVar175);
        local_820 = vmaxps_avx(local_680,auVar228);
        _local_2e0 = local_820;
        auVar111 = vcmpps_avx(local_680,local_300,2);
        local_560 = vandps_avx(auVar111,auVar110);
        local_600 = local_560;
        auVar111 = vcmpps_avx(local_820,local_2c0,2);
        local_620 = vandps_avx(auVar111,auVar110);
        auVar110 = vorps_avx(local_620,local_560);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar110[0x1f] < '\0') {
          local_5a0 = local_620;
          local_860 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5e0._0_4_ = auVar16._0_4_ ^ local_860._0_4_;
          local_5e0._4_4_ = auVar16._4_4_ ^ local_860._4_4_;
          local_5e0._8_4_ = (float)(auVar16._8_4_ ^ local_860._8_4_);
          local_5e0._12_4_ = (float)(auVar16._12_4_ ^ local_860._12_4_);
          local_5e0._16_4_ = (float)(auVar16._16_4_ ^ local_860._16_4_);
          local_5e0._20_4_ = (float)(auVar16._20_4_ ^ local_860._20_4_);
          local_5e0._24_4_ = (float)(auVar16._24_4_ ^ local_860._24_4_);
          local_5e0._28_4_ = (float)((uint)auVar16._28_4_ ^ (uint)local_860._28_4_);
          auVar116._0_4_ =
               auVar190._0_4_ * (float)local_7c0._0_4_ +
               auVar209._0_4_ * (float)local_7e0._0_4_ + auVar322._0_4_ * (float)local_800._0_4_;
          auVar116._4_4_ =
               auVar190._4_4_ * (float)local_7c0._4_4_ +
               auVar209._4_4_ * (float)local_7e0._4_4_ + auVar322._4_4_ * (float)local_800._4_4_;
          auVar116._8_4_ =
               auVar190._8_4_ * fStack_7b8 +
               auVar209._8_4_ * fStack_7d8 + auVar322._8_4_ * fStack_7f8;
          auVar116._12_4_ =
               auVar190._12_4_ * fStack_7b4 +
               auVar209._12_4_ * fStack_7d4 + auVar322._12_4_ * fStack_7f4;
          auVar116._16_4_ =
               auVar190._16_4_ * fStack_7b0 +
               auVar209._16_4_ * fStack_7d0 + auVar322._16_4_ * fStack_7f0;
          auVar116._20_4_ =
               auVar190._20_4_ * fStack_7ac +
               auVar209._20_4_ * fStack_7cc + auVar322._20_4_ * fStack_7ec;
          auVar116._24_4_ =
               auVar190._24_4_ * fStack_7a8 +
               auVar209._24_4_ * fStack_7c8 + auVar322._24_4_ * fStack_7e8;
          auVar116._28_4_ = local_860._28_4_ + auVar16._28_4_ + local_560._28_4_;
          auVar140._8_4_ = 0x7fffffff;
          auVar140._0_8_ = 0x7fffffff7fffffff;
          auVar140._12_4_ = 0x7fffffff;
          auVar140._16_4_ = 0x7fffffff;
          auVar140._20_4_ = 0x7fffffff;
          auVar140._24_4_ = 0x7fffffff;
          auVar140._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar116,auVar140);
          auVar141._8_4_ = 0x3e99999a;
          auVar141._0_8_ = 0x3e99999a3e99999a;
          auVar141._12_4_ = 0x3e99999a;
          auVar141._16_4_ = 0x3e99999a;
          auVar141._20_4_ = 0x3e99999a;
          auVar141._24_4_ = 0x3e99999a;
          auVar141._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar141,1);
          auVar110 = vorps_avx(auVar110,local_5e0);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar178._8_4_ = 2;
          auVar178._0_8_ = 0x200000002;
          auVar178._12_4_ = 2;
          auVar178._16_4_ = 2;
          auVar178._20_4_ = 2;
          auVar178._24_4_ = 2;
          auVar178._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar178,auVar142,auVar110);
          local_5c0 = ZEXT432((uint)uVar93);
          auVar185 = vpshufd_avx(ZEXT416((uint)uVar93),0);
          auVar126 = vpcmpgtd_avx(auVar110._16_16_,auVar185);
          local_6a0._0_16_ = auVar185;
          auVar185 = vpcmpgtd_avx(auVar110._0_16_,auVar185);
          auVar143._16_16_ = auVar126;
          auVar143._0_16_ = auVar185;
          local_580 = vblendps_avx(ZEXT1632(auVar185),auVar143,0xf0);
          local_600 = vandnps_avx(local_580,local_560);
          auVar110 = local_560 & ~local_580;
          auVar249 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_640._0_8_ = uVar93;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            local_840._4_4_ = local_680._4_4_ + (float)local_980._4_4_;
            local_840._0_4_ = local_680._0_4_ + (float)local_980._0_4_;
            fStack_838 = local_680._8_4_ + fStack_978;
            fStack_834 = local_680._12_4_ + fStack_974;
            fStack_830 = local_680._16_4_ + fStack_970;
            fStack_82c = local_680._20_4_ + fStack_96c;
            fStack_828 = local_680._24_4_ + fStack_968;
            fStack_824 = local_680._28_4_ + fStack_964;
            do {
              auVar201 = auVar249._0_16_;
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar144,auVar296._0_32_,local_600);
              auVar111 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar111 = vminps_avx(auVar110,auVar111);
              auVar210 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar210);
              auVar210 = vperm2f128_avx(auVar111,auVar111,1);
              auVar111 = vminps_avx(auVar111,auVar210);
              auVar111 = vcmpps_avx(auVar110,auVar111,0);
              auVar210 = local_600 & auVar111;
              auVar110 = local_600;
              if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar210 >> 0x7f,0) != '\0') ||
                    (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar210 >> 0xbf,0) != '\0') ||
                  (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar210[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar111,local_600);
              }
              uVar90 = vmovmskps_avx(auVar110);
              uVar3 = 0;
              if (uVar90 != 0) {
                for (; (uVar90 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              uVar93 = (ulong)uVar3;
              *(undefined4 *)(local_600 + uVar93 * 4) = 0;
              fVar182 = local_520[uVar93];
              uVar3 = *(uint *)(local_320 + uVar93 * 4);
              fVar235 = local_b04;
              if ((float)local_900._0_4_ < 0.0) {
                fVar235 = sqrtf((float)local_900._0_4_);
                auVar201._8_4_ = 0x7fffffff;
                auVar201._0_8_ = 0x7fffffff7fffffff;
                auVar201._12_4_ = 0x7fffffff;
              }
              auVar365 = ZEXT464(uVar3);
              auVar358 = ZEXT464((uint)fVar182);
              auVar185 = vminps_avx(_local_a20,_local_a40);
              auVar126 = vmaxps_avx(_local_a20,_local_a40);
              auVar101 = vminps_avx(_local_a30,_local_a50);
              auVar127 = vminps_avx(auVar185,auVar101);
              auVar185 = vmaxps_avx(_local_a30,_local_a50);
              auVar101 = vmaxps_avx(auVar126,auVar185);
              auVar126 = vandps_avx(auVar127,auVar201);
              auVar185 = vandps_avx(auVar101,auVar201);
              auVar126 = vmaxps_avx(auVar126,auVar185);
              auVar185 = vmovshdup_avx(auVar126);
              auVar185 = vmaxss_avx(auVar185,auVar126);
              auVar126 = vshufpd_avx(auVar126,auVar126,1);
              auVar126 = vmaxss_avx(auVar126,auVar185);
              local_9c0._0_4_ = auVar126._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar235 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar101,auVar101,0xff);
              lVar92 = 4;
              do {
                auVar126 = vshufps_avx(auVar365._0_16_,auVar365._0_16_,0);
                auVar100._0_4_ = auVar126._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar100._4_4_ = auVar126._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar100._8_4_ = auVar126._8_4_ * fStack_8e8 + 0.0;
                auVar100._12_4_ = auVar126._12_4_ * fStack_8e4 + 0.0;
                fVar236 = auVar358._0_4_;
                fVar196 = 1.0 - fVar236;
                fVar182 = fVar236 * fVar236;
                fVar235 = fVar236 * 3.0;
                local_b00._0_4_ = fVar235 + -5.0;
                local_aa0._0_4_ = fVar196 * fVar196;
                auVar126 = ZEXT416((uint)(fVar236 * fVar236 * -fVar196 * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar185 = ZEXT416((uint)((fVar196 * fVar196 * (fVar196 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar101 = ZEXT416((uint)((fVar182 * (fVar235 + -5.0) + 2.0) * 0.5));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar127 = ZEXT416((uint)(fVar196 * fVar196 * -fVar236 * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar166._0_4_ =
                     auVar127._0_4_ * (float)local_a20._0_4_ +
                     auVar101._0_4_ * (float)local_a40._0_4_ +
                     auVar185._0_4_ * (float)local_a30._0_4_ +
                     auVar126._0_4_ * (float)local_a50._0_4_;
                auVar166._4_4_ =
                     auVar127._4_4_ * (float)local_a20._4_4_ +
                     auVar101._4_4_ * (float)local_a40._4_4_ +
                     auVar185._4_4_ * (float)local_a30._4_4_ +
                     auVar126._4_4_ * (float)local_a50._4_4_;
                auVar166._8_4_ =
                     auVar127._8_4_ * fStack_a18 +
                     auVar101._8_4_ * fStack_a38 +
                     auVar185._8_4_ * fStack_a28 + auVar126._8_4_ * fStack_a48;
                auVar166._12_4_ =
                     auVar127._12_4_ * fStack_a14 +
                     auVar101._12_4_ * fStack_a34 +
                     auVar185._12_4_ * fStack_a24 + auVar126._12_4_ * fStack_a44;
                local_8e0._0_16_ = auVar166;
                auVar126 = vsubps_avx(auVar100,auVar166);
                _local_9e0 = auVar126;
                auVar126 = vdpps_avx(auVar126,auVar126,0x7f);
                local_a80._0_16_ = ZEXT416((uint)(fVar236 * -9.0 + 4.0));
                fVar197 = auVar126._0_4_;
                local_ba0 = auVar365._0_4_;
                if (fVar197 < 0.0) {
                  local_ac0._0_4_ = fVar182;
                  local_ae0._0_16_ = ZEXT416((uint)fVar196);
                  local_920._0_4_ = fVar235;
                  local_940._0_4_ = fVar236 * 9.0;
                  local_960._0_4_ = fVar196 * -2.0;
                  fVar237 = sqrtf(fVar197);
                  fVar250 = (float)local_940._0_4_;
                  fVar198 = (float)local_960._0_4_;
                  fVar182 = (float)local_ac0._0_4_;
                  fVar240 = (float)local_920._0_4_;
                  fVar196 = (float)local_ae0._0_4_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar126,auVar126);
                  fVar237 = auVar185._0_4_;
                  fVar250 = fVar236 * 9.0;
                  fVar198 = fVar196 * -2.0;
                  fVar240 = fVar235;
                }
                auVar185 = ZEXT416((uint)((fVar182 + fVar198 * fVar236) * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar101 = ZEXT416((uint)(((fVar196 + fVar196) * (fVar240 + 2.0) +
                                          fVar196 * fVar196 * -3.0) * 0.5));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar127 = ZEXT416((uint)(((fVar236 + fVar236) * (float)local_b00._0_4_ +
                                          fVar236 * fVar240) * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar128 = ZEXT416((uint)((fVar236 * (fVar196 + fVar196) - (float)local_aa0._0_4_) *
                                         0.5));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar381._0_4_ =
                     (float)local_a20._0_4_ * auVar128._0_4_ +
                     (float)local_a40._0_4_ * auVar127._0_4_ +
                     (float)local_a50._0_4_ * auVar185._0_4_ +
                     (float)local_a30._0_4_ * auVar101._0_4_;
                auVar381._4_4_ =
                     (float)local_a20._4_4_ * auVar128._4_4_ +
                     (float)local_a40._4_4_ * auVar127._4_4_ +
                     (float)local_a50._4_4_ * auVar185._4_4_ +
                     (float)local_a30._4_4_ * auVar101._4_4_;
                auVar381._8_4_ =
                     fStack_a18 * auVar128._8_4_ +
                     fStack_a38 * auVar127._8_4_ +
                     fStack_a48 * auVar185._8_4_ + fStack_a28 * auVar101._8_4_;
                auVar381._12_4_ =
                     fStack_a14 * auVar128._12_4_ +
                     fStack_a34 * auVar127._12_4_ +
                     fStack_a44 * auVar185._12_4_ + fStack_a24 * auVar101._12_4_;
                auVar128 = vpermilps_avx(ZEXT416((uint)(fVar235 + -1.0)),0);
                auVar15 = vpermilps_avx(local_a80._0_16_,0);
                auVar185 = vshufps_avx(ZEXT416((uint)(fVar250 + -5.0)),
                                       ZEXT416((uint)(fVar250 + -5.0)),0);
                auVar101 = ZEXT416((uint)(fVar236 * -3.0 + 2.0));
                auVar127 = vshufps_avx(auVar101,auVar101,0);
                auVar101 = vdpps_avx(auVar381,auVar381,0x7f);
                auVar129._0_4_ =
                     (float)local_a20._0_4_ * auVar127._0_4_ +
                     (float)local_a40._0_4_ * auVar185._0_4_ +
                     (float)local_a30._0_4_ * auVar15._0_4_ +
                     (float)local_a50._0_4_ * auVar128._0_4_;
                auVar129._4_4_ =
                     (float)local_a20._4_4_ * auVar127._4_4_ +
                     (float)local_a40._4_4_ * auVar185._4_4_ +
                     (float)local_a30._4_4_ * auVar15._4_4_ +
                     (float)local_a50._4_4_ * auVar128._4_4_;
                auVar129._8_4_ =
                     fStack_a18 * auVar127._8_4_ +
                     fStack_a38 * auVar185._8_4_ +
                     fStack_a28 * auVar15._8_4_ + fStack_a48 * auVar128._8_4_;
                auVar129._12_4_ =
                     fStack_a14 * auVar127._12_4_ +
                     fStack_a34 * auVar185._12_4_ +
                     fStack_a24 * auVar15._12_4_ + fStack_a44 * auVar128._12_4_;
                auVar185 = vblendps_avx(auVar101,_DAT_01feba10,0xe);
                auVar127 = vrsqrtss_avx(auVar185,auVar185);
                fVar235 = auVar127._0_4_;
                fVar182 = auVar101._0_4_;
                auVar127 = vdpps_avx(auVar381,auVar129,0x7f);
                auVar128 = vshufps_avx(auVar101,auVar101,0);
                auVar130._0_4_ = auVar129._0_4_ * auVar128._0_4_;
                auVar130._4_4_ = auVar129._4_4_ * auVar128._4_4_;
                auVar130._8_4_ = auVar129._8_4_ * auVar128._8_4_;
                auVar130._12_4_ = auVar129._12_4_ * auVar128._12_4_;
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar202._0_4_ = auVar381._0_4_ * auVar127._0_4_;
                auVar202._4_4_ = auVar381._4_4_ * auVar127._4_4_;
                auVar202._8_4_ = auVar381._8_4_ * auVar127._8_4_;
                auVar202._12_4_ = auVar381._12_4_ * auVar127._12_4_;
                auVar15 = vsubps_avx(auVar130,auVar202);
                auVar127 = vrcpss_avx(auVar185,auVar185);
                auVar185 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                      ZEXT416((uint)(local_ba0 * (float)local_780._0_4_)));
                auVar354 = ZEXT1664(auVar185);
                auVar127 = ZEXT416((uint)(auVar127._0_4_ * (2.0 - fVar182 * auVar127._0_4_)));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                uVar93 = CONCAT44(auVar381._4_4_,auVar381._0_4_);
                auVar224._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar224._8_4_ = -auVar381._8_4_;
                auVar224._12_4_ = -auVar381._12_4_;
                auVar128 = ZEXT416((uint)(fVar235 * 1.5 +
                                         fVar182 * -0.5 * fVar235 * fVar235 * fVar235));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar186._0_4_ = auVar128._0_4_ * auVar15._0_4_ * auVar127._0_4_;
                auVar186._4_4_ = auVar128._4_4_ * auVar15._4_4_ * auVar127._4_4_;
                auVar186._8_4_ = auVar128._8_4_ * auVar15._8_4_ * auVar127._8_4_;
                auVar186._12_4_ = auVar128._12_4_ * auVar15._12_4_ * auVar127._12_4_;
                auVar244._0_4_ = auVar381._0_4_ * auVar128._0_4_;
                auVar244._4_4_ = auVar381._4_4_ * auVar128._4_4_;
                auVar244._8_4_ = auVar381._8_4_ * auVar128._8_4_;
                auVar244._12_4_ = auVar381._12_4_ * auVar128._12_4_;
                local_b00._0_16_ = auVar381;
                local_a80._0_4_ = auVar185._0_4_;
                if (fVar182 < 0.0) {
                  local_aa0._0_16_ = auVar224;
                  local_ac0._0_16_ = auVar244;
                  local_ae0._0_16_ = auVar186;
                  fVar182 = sqrtf(fVar182);
                  auVar354 = ZEXT464((uint)local_a80._0_4_);
                  auVar186 = local_ae0._0_16_;
                  auVar224 = local_aa0._0_16_;
                  auVar244 = local_ac0._0_16_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar101,auVar101);
                  fVar182 = auVar185._0_4_;
                }
                auVar185 = vdpps_avx(_local_9e0,auVar244,0x7f);
                fVar182 = ((float)local_9c0._0_4_ / fVar182) * (fVar237 + 1.0) +
                          auVar354._0_4_ + fVar237 * (float)local_9c0._0_4_;
                auVar101 = vdpps_avx(auVar224,auVar244,0x7f);
                auVar127 = vdpps_avx(_local_9e0,auVar186,0x7f);
                auVar128 = vdpps_avx(_local_8f0,auVar244,0x7f);
                auVar15 = vdpps_avx(_local_9e0,auVar224,0x7f);
                fVar235 = auVar101._0_4_ + auVar127._0_4_;
                fVar196 = auVar185._0_4_;
                auVar102._0_4_ = fVar196 * fVar196;
                auVar102._4_4_ = auVar185._4_4_ * auVar185._4_4_;
                auVar102._8_4_ = auVar185._8_4_ * auVar185._8_4_;
                auVar102._12_4_ = auVar185._12_4_ * auVar185._12_4_;
                auVar127 = vsubps_avx(auVar126,auVar102);
                auVar101 = vdpps_avx(_local_9e0,_local_8f0,0x7f);
                fVar237 = auVar15._0_4_ - fVar196 * fVar235;
                fVar198 = auVar101._0_4_ - fVar196 * auVar128._0_4_;
                auVar101 = vrsqrtss_avx(auVar127,auVar127);
                fVar240 = auVar127._0_4_;
                fVar196 = auVar101._0_4_;
                fVar196 = fVar196 * 1.5 + fVar240 * -0.5 * fVar196 * fVar196 * fVar196;
                if (fVar240 < 0.0) {
                  local_aa0._0_4_ = fVar182;
                  local_ac0._0_16_ = ZEXT416((uint)fVar235);
                  local_ae0._0_16_ = auVar128;
                  local_920._0_4_ = fVar237;
                  local_940._0_4_ = fVar198;
                  local_960._0_4_ = fVar196;
                  fVar240 = sqrtf(fVar240);
                  auVar354 = ZEXT464((uint)local_a80._0_4_);
                  fVar196 = (float)local_960._0_4_;
                  fVar237 = (float)local_920._0_4_;
                  fVar198 = (float)local_940._0_4_;
                  auVar128 = local_ae0._0_16_;
                  fVar182 = (float)local_aa0._0_4_;
                  auVar101 = local_ac0._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar127,auVar127);
                  fVar240 = auVar101._0_4_;
                  auVar101 = ZEXT416((uint)fVar235);
                }
                auVar386 = ZEXT1664(auVar185);
                auVar98 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar97 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar235 = fVar237 * fVar196 - auVar97._0_4_;
                auVar203._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar128._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar128._12_4_ ^ 0x80000000;
                auVar225._0_4_ = -fVar235;
                auVar225._4_4_ = 0x80000000;
                auVar225._8_4_ = 0x80000000;
                auVar225._12_4_ = 0x80000000;
                auVar127 = vinsertps_avx(ZEXT416((uint)(fVar198 * fVar196)),auVar203,0x10);
                auVar15 = vmovsldup_avx(ZEXT416((uint)(auVar101._0_4_ * fVar198 * fVar196 -
                                                      auVar128._0_4_ * fVar235)));
                auVar127 = vdivps_avx(auVar127,auVar15);
                auVar98 = ZEXT416((uint)(fVar240 - auVar98._0_4_));
                auVar128 = vinsertps_avx(auVar185,auVar98,0x10);
                auVar187._0_4_ = auVar128._0_4_ * auVar127._0_4_;
                auVar187._4_4_ = auVar128._4_4_ * auVar127._4_4_;
                auVar187._8_4_ = auVar128._8_4_ * auVar127._8_4_;
                auVar187._12_4_ = auVar128._12_4_ * auVar127._12_4_;
                auVar101 = vinsertps_avx(auVar225,auVar101,0x1c);
                auVar101 = vdivps_avx(auVar101,auVar15);
                auVar167._0_4_ = auVar128._0_4_ * auVar101._0_4_;
                auVar167._4_4_ = auVar128._4_4_ * auVar101._4_4_;
                auVar167._8_4_ = auVar128._8_4_ * auVar101._8_4_;
                auVar167._12_4_ = auVar128._12_4_ * auVar101._12_4_;
                auVar101 = vhaddps_avx(auVar187,auVar187);
                auVar127 = vhaddps_avx(auVar167,auVar167);
                fVar236 = fVar236 - auVar101._0_4_;
                local_ba0 = local_ba0 - auVar127._0_4_;
                auVar365 = ZEXT464((uint)local_ba0);
                auVar204._8_4_ = 0x7fffffff;
                auVar204._0_8_ = 0x7fffffff7fffffff;
                auVar204._12_4_ = 0x7fffffff;
                auVar249 = ZEXT1664(auVar204);
                auVar101 = vandps_avx(auVar185,auVar204);
                if (fVar182 <= auVar101._0_4_) {
LAB_00f4bcc4:
                  bVar68 = false;
                }
                else {
                  auVar101 = vandps_avx(auVar98,auVar204);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar354._0_4_ + fVar182 <=
                      auVar101._0_4_) goto LAB_00f4bcc4;
                  local_ba0 = local_ba0 + (float)local_8c0._0_4_;
                  auVar365 = ZEXT464((uint)local_ba0);
                  bVar68 = true;
                  if (((fVar220 <= local_ba0) &&
                      (fVar182 = *(float *)(ray + k * 4 + 0x80), local_ba0 <= fVar182)) &&
                     ((0.0 <= fVar236 && (fVar236 <= 1.0)))) {
                    auVar126 = vrsqrtss_avx(auVar126,auVar126);
                    fVar235 = auVar126._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar126 = ZEXT416((uint)(fVar235 * 1.5 +
                                               fVar197 * -0.5 * fVar235 * fVar235 * fVar235));
                      auVar126 = vshufps_avx(auVar126,auVar126,0);
                      auVar131._0_4_ = auVar126._0_4_ * (float)local_9e0._0_4_;
                      auVar131._4_4_ = auVar126._4_4_ * (float)local_9e0._4_4_;
                      auVar131._8_4_ = auVar126._8_4_ * fStack_9d8;
                      auVar131._12_4_ = auVar126._12_4_ * fStack_9d4;
                      auVar103._0_4_ = local_b00._0_4_ + auVar97._0_4_ * auVar131._0_4_;
                      auVar103._4_4_ = local_b00._4_4_ + auVar97._4_4_ * auVar131._4_4_;
                      auVar103._8_4_ = local_b00._8_4_ + auVar97._8_4_ * auVar131._8_4_;
                      auVar103._12_4_ = local_b00._12_4_ + auVar97._12_4_ * auVar131._12_4_;
                      auVar126 = vshufps_avx(auVar131,auVar131,0xc9);
                      auVar101 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar132._0_4_ = auVar101._0_4_ * auVar131._0_4_;
                      auVar132._4_4_ = auVar101._4_4_ * auVar131._4_4_;
                      auVar132._8_4_ = auVar101._8_4_ * auVar131._8_4_;
                      auVar132._12_4_ = auVar101._12_4_ * auVar131._12_4_;
                      auVar168._0_4_ = local_b00._0_4_ * auVar126._0_4_;
                      auVar168._4_4_ = local_b00._4_4_ * auVar126._4_4_;
                      auVar168._8_4_ = local_b00._8_4_ * auVar126._8_4_;
                      auVar168._12_4_ = local_b00._12_4_ * auVar126._12_4_;
                      auVar127 = vsubps_avx(auVar168,auVar132);
                      auVar126 = vshufps_avx(auVar127,auVar127,0xc9);
                      auVar101 = vshufps_avx(auVar103,auVar103,0xc9);
                      auVar169._0_4_ = auVar101._0_4_ * auVar126._0_4_;
                      auVar169._4_4_ = auVar101._4_4_ * auVar126._4_4_;
                      auVar169._8_4_ = auVar101._8_4_ * auVar126._8_4_;
                      auVar169._12_4_ = auVar101._12_4_ * auVar126._12_4_;
                      auVar126 = vshufps_avx(auVar127,auVar127,0xd2);
                      auVar104._0_4_ = auVar103._0_4_ * auVar126._0_4_;
                      auVar104._4_4_ = auVar103._4_4_ * auVar126._4_4_;
                      auVar104._8_4_ = auVar103._8_4_ * auVar126._8_4_;
                      auVar104._12_4_ = auVar103._12_4_ * auVar126._12_4_;
                      auVar126 = vsubps_avx(auVar169,auVar104);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_ba0;
                        uVar1 = vextractps_avx(auVar126,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar126,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar126._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar236;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar88;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_710 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
                        local_740 = (RTCHitN  [16])vshufps_avx(auVar126,auVar126,0x55);
                        auVar101 = vshufps_avx(auVar126,auVar126,0xaa);
                        local_720 = vshufps_avx(auVar126,auVar126,0);
                        auStack_730 = auVar101;
                        local_700 = ZEXT816(0) << 0x20;
                        local_6f0 = local_760._0_8_;
                        uStack_6e8 = local_760._8_8_;
                        local_6e0 = local_750._0_8_;
                        uStack_6d8 = local_750._8_8_;
                        uVar3 = context->user->instID[0];
                        _local_6d0 = CONCAT44(uVar3,uVar3);
                        _uStack_6c8 = CONCAT44(uVar3,uVar3);
                        uVar3 = context->user->instPrimID[0];
                        _uStack_6c0 = CONCAT44(uVar3,uVar3);
                        _uStack_6b8 = CONCAT44(uVar3,uVar3);
                        *(float *)(ray + k * 4 + 0x80) = local_ba0;
                        local_b20 = *local_988;
                        uStack_b18 = local_988[1];
                        local_a10.valid = (int *)&local_b20;
                        local_a10.geometryUserPtr = pGVar4->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = local_740;
                        local_a10.N = 4;
                        local_a10.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar354 = ZEXT1664(auVar354._0_16_);
                          auVar386 = ZEXT1664(auVar185);
                          (*pGVar4->intersectionFilterN)(&local_a10);
                        }
                        auVar82._8_8_ = uStack_b18;
                        auVar82._0_8_ = local_b20;
                        if (auVar82 == (undefined1  [16])0x0) {
                          auVar126 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar126 = auVar126 ^ _DAT_01febe20;
                          auVar249 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar249 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar354 = ZEXT1664(auVar354._0_16_);
                            auVar386 = ZEXT1664(auVar386._0_16_);
                            (*p_Var5)(&local_a10);
                            auVar249 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar83._8_8_ = uStack_b18;
                          auVar83._0_8_ = local_b20;
                          auVar185 = vpcmpeqd_avx(auVar83,_DAT_01feba10);
                          auVar101 = vpcmpeqd_avx(auVar101,auVar101);
                          auVar126 = auVar185 ^ auVar101;
                          if (auVar83 != (undefined1  [16])0x0) {
                            auVar185 = auVar185 ^ auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])local_a10.hit);
                            *(undefined1 (*) [16])(local_a10.ray + 0xc0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x10));
                            *(undefined1 (*) [16])(local_a10.ray + 0xd0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x20));
                            *(undefined1 (*) [16])(local_a10.ray + 0xe0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x30));
                            *(undefined1 (*) [16])(local_a10.ray + 0xf0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x40));
                            *(undefined1 (*) [16])(local_a10.ray + 0x100) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x50));
                            *(undefined1 (*) [16])(local_a10.ray + 0x110) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x60));
                            *(undefined1 (*) [16])(local_a10.ray + 0x120) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x70));
                            *(undefined1 (*) [16])(local_a10.ray + 0x130) = auVar101;
                            auVar185 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x80));
                            *(undefined1 (*) [16])(local_a10.ray + 0x140) = auVar185;
                          }
                        }
                        auVar365 = ZEXT464((uint)local_ba0);
                        auVar133._8_8_ = 0x100000001;
                        auVar133._0_8_ = 0x100000001;
                        if ((auVar133 & auVar126) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar182;
                        }
                      }
                    }
                  }
                }
                auVar110 = local_600;
                auVar358 = ZEXT464((uint)fVar236);
                bVar94 = lVar92 != 0;
                lVar92 = lVar92 + -1;
              } while ((!bVar68) && (bVar94));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar117._4_4_ = uVar1;
              auVar117._0_4_ = uVar1;
              auVar117._8_4_ = uVar1;
              auVar117._12_4_ = uVar1;
              auVar117._16_4_ = uVar1;
              auVar117._20_4_ = uVar1;
              auVar117._24_4_ = uVar1;
              auVar117._28_4_ = uVar1;
              auVar111 = vcmpps_avx(_local_840,auVar117,2);
              local_600 = vandps_avx(auVar111,local_600);
              auVar110 = auVar110 & auVar111;
              auVar296 = ZEXT3264(local_680);
              uVar93 = local_640._0_8_;
            } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar110 >> 0x7f,0) != '\0') ||
                       (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar110 >> 0xbf,0) != '\0') ||
                     (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar110[0x1f] < '\0');
          }
          auVar118._0_4_ =
               (float)local_880._0_4_ * (float)local_7c0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
               (float)local_660._0_4_ * (float)local_800._0_4_;
          auVar118._4_4_ =
               (float)local_880._4_4_ * (float)local_7c0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
               (float)local_660._4_4_ * (float)local_800._4_4_;
          auVar118._8_4_ =
               fStack_878 * fStack_7b8 + fStack_898 * fStack_7d8 + fStack_658 * fStack_7f8;
          auVar118._12_4_ =
               fStack_874 * fStack_7b4 + fStack_894 * fStack_7d4 + fStack_654 * fStack_7f4;
          auVar118._16_4_ =
               fStack_870 * fStack_7b0 + fStack_890 * fStack_7d0 + fStack_650 * fStack_7f0;
          auVar118._20_4_ =
               fStack_86c * fStack_7ac + fStack_88c * fStack_7cc + fStack_64c * fStack_7ec;
          auVar118._24_4_ =
               fStack_868 * fStack_7a8 + fStack_888 * fStack_7c8 + fStack_648 * fStack_7e8;
          auVar118._28_4_ = fStack_864 + fStack_884 + fStack_644;
          auVar145._8_4_ = 0x7fffffff;
          auVar145._0_8_ = 0x7fffffff7fffffff;
          auVar145._12_4_ = 0x7fffffff;
          auVar145._16_4_ = 0x7fffffff;
          auVar145._20_4_ = 0x7fffffff;
          auVar145._24_4_ = 0x7fffffff;
          auVar145._28_4_ = 0x7fffffff;
          auVar110 = vandps_avx(auVar118,auVar145);
          auVar146._8_4_ = 0x3e99999a;
          auVar146._0_8_ = 0x3e99999a3e99999a;
          auVar146._12_4_ = 0x3e99999a;
          auVar146._16_4_ = 0x3e99999a;
          auVar146._20_4_ = 0x3e99999a;
          auVar146._24_4_ = 0x3e99999a;
          auVar146._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar146,1);
          auVar111 = vorps_avx(auVar110,local_5e0);
          auVar147._0_4_ = local_820._0_4_ + (float)local_980._0_4_;
          auVar147._4_4_ = local_820._4_4_ + (float)local_980._4_4_;
          auVar147._8_4_ = local_820._8_4_ + fStack_978;
          auVar147._12_4_ = local_820._12_4_ + fStack_974;
          auVar147._16_4_ = local_820._16_4_ + fStack_970;
          auVar147._20_4_ = local_820._20_4_ + fStack_96c;
          auVar147._24_4_ = local_820._24_4_ + fStack_968;
          auVar147._28_4_ = local_820._28_4_ + fStack_964;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar179._4_4_ = uVar1;
          auVar179._0_4_ = uVar1;
          auVar179._8_4_ = uVar1;
          auVar179._12_4_ = uVar1;
          auVar179._16_4_ = uVar1;
          auVar179._20_4_ = uVar1;
          auVar179._24_4_ = uVar1;
          auVar179._28_4_ = uVar1;
          auVar110 = vcmpps_avx(auVar147,auVar179,2);
          _local_880 = vandps_avx(auVar110,local_5a0);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar180._8_4_ = 2;
          auVar180._0_8_ = 0x200000002;
          auVar180._12_4_ = 2;
          auVar180._16_4_ = 2;
          auVar180._20_4_ = 2;
          auVar180._24_4_ = 2;
          auVar180._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar180,auVar148,auVar111);
          auVar126 = vpcmpgtd_avx(auVar110._16_16_,local_6a0._0_16_);
          auVar185 = vpshufd_avx(local_5c0._0_16_,0);
          auVar185 = vpcmpgtd_avx(auVar110._0_16_,auVar185);
          auVar149._16_16_ = auVar126;
          auVar149._0_16_ = auVar185;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar185),auVar149,0xf0);
          local_620 = vandnps_avx(_local_8a0,_local_880);
          auVar110 = _local_880 & ~_local_8a0;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            local_820 = _local_2e0;
            local_840._4_4_ = (float)local_2e0._4_4_ + (float)local_980._4_4_;
            local_840._0_4_ = (float)local_2e0._0_4_ + (float)local_980._0_4_;
            fStack_838 = fStack_2d8 + fStack_978;
            fStack_834 = fStack_2d4 + fStack_974;
            fStack_830 = fStack_2d0 + fStack_970;
            fStack_82c = fStack_2cc + fStack_96c;
            fStack_828 = fStack_2c8 + fStack_968;
            fStack_824 = fStack_2c4 + fStack_964;
            do {
              auVar205 = auVar249._0_16_;
              auVar150._8_4_ = 0x7f800000;
              auVar150._0_8_ = 0x7f8000007f800000;
              auVar150._12_4_ = 0x7f800000;
              auVar150._16_4_ = 0x7f800000;
              auVar150._20_4_ = 0x7f800000;
              auVar150._24_4_ = 0x7f800000;
              auVar150._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar150,local_820,local_620);
              auVar111 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar111 = vminps_avx(auVar110,auVar111);
              auVar210 = vshufpd_avx(auVar111,auVar111,5);
              auVar111 = vminps_avx(auVar111,auVar210);
              auVar210 = vperm2f128_avx(auVar111,auVar111,1);
              auVar111 = vminps_avx(auVar111,auVar210);
              auVar111 = vcmpps_avx(auVar110,auVar111,0);
              auVar210 = local_620 & auVar111;
              auVar110 = local_620;
              if ((((((((auVar210 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar210 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar210 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar210 >> 0x7f,0) != '\0') ||
                    (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar210 >> 0xbf,0) != '\0') ||
                  (auVar210 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar210[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar111,local_620);
              }
              uVar90 = vmovmskps_avx(auVar110);
              uVar3 = 0;
              if (uVar90 != 0) {
                for (; (uVar90 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                }
              }
              uVar93 = (ulong)uVar3;
              *(undefined4 *)(local_620 + uVar93 * 4) = 0;
              fVar182 = local_540[uVar93];
              uVar3 = *(uint *)(local_2c0 + uVar93 * 4);
              fVar235 = local_b08;
              if ((float)local_900._0_4_ < 0.0) {
                fVar235 = sqrtf((float)local_900._0_4_);
                auVar205._8_4_ = 0x7fffffff;
                auVar205._0_8_ = 0x7fffffff7fffffff;
                auVar205._12_4_ = 0x7fffffff;
              }
              auVar365 = ZEXT464(uVar3);
              auVar358 = ZEXT464((uint)fVar182);
              auVar185 = vminps_avx(_local_a20,_local_a40);
              auVar126 = vmaxps_avx(_local_a20,_local_a40);
              auVar101 = vminps_avx(_local_a30,_local_a50);
              auVar127 = vminps_avx(auVar185,auVar101);
              auVar185 = vmaxps_avx(_local_a30,_local_a50);
              auVar101 = vmaxps_avx(auVar126,auVar185);
              auVar126 = vandps_avx(auVar127,auVar205);
              auVar185 = vandps_avx(auVar101,auVar205);
              auVar126 = vmaxps_avx(auVar126,auVar185);
              auVar185 = vmovshdup_avx(auVar126);
              auVar185 = vmaxss_avx(auVar185,auVar126);
              auVar126 = vshufpd_avx(auVar126,auVar126,1);
              auVar126 = vmaxss_avx(auVar126,auVar185);
              local_9c0._0_4_ = auVar126._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar235 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar101,auVar101,0xff);
              lVar92 = 4;
              do {
                auVar126 = vshufps_avx(auVar365._0_16_,auVar365._0_16_,0);
                auVar105._0_4_ = auVar126._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar105._4_4_ = auVar126._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar105._8_4_ = auVar126._8_4_ * fStack_8e8 + 0.0;
                auVar105._12_4_ = auVar126._12_4_ * fStack_8e4 + 0.0;
                fVar236 = auVar358._0_4_;
                fVar196 = 1.0 - fVar236;
                fVar182 = fVar236 * fVar236;
                fVar235 = fVar236 * 3.0;
                local_b00._0_4_ = fVar235 + -5.0;
                local_aa0._0_4_ = fVar196 * fVar196;
                auVar126 = ZEXT416((uint)(fVar236 * fVar236 * -fVar196 * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar185 = ZEXT416((uint)((fVar196 * fVar196 * (fVar196 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar101 = ZEXT416((uint)((fVar182 * (fVar235 + -5.0) + 2.0) * 0.5));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar127 = ZEXT416((uint)(fVar196 * fVar196 * -fVar236 * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar170._0_4_ =
                     auVar127._0_4_ * (float)local_a20._0_4_ +
                     auVar101._0_4_ * (float)local_a40._0_4_ +
                     auVar185._0_4_ * (float)local_a30._0_4_ +
                     auVar126._0_4_ * (float)local_a50._0_4_;
                auVar170._4_4_ =
                     auVar127._4_4_ * (float)local_a20._4_4_ +
                     auVar101._4_4_ * (float)local_a40._4_4_ +
                     auVar185._4_4_ * (float)local_a30._4_4_ +
                     auVar126._4_4_ * (float)local_a50._4_4_;
                auVar170._8_4_ =
                     auVar127._8_4_ * fStack_a18 +
                     auVar101._8_4_ * fStack_a38 +
                     auVar185._8_4_ * fStack_a28 + auVar126._8_4_ * fStack_a48;
                auVar170._12_4_ =
                     auVar127._12_4_ * fStack_a14 +
                     auVar101._12_4_ * fStack_a34 +
                     auVar185._12_4_ * fStack_a24 + auVar126._12_4_ * fStack_a44;
                local_8e0._0_16_ = auVar170;
                auVar126 = vsubps_avx(auVar105,auVar170);
                _local_9e0 = auVar126;
                auVar126 = vdpps_avx(auVar126,auVar126,0x7f);
                local_a80._0_16_ = ZEXT416((uint)(fVar236 * -9.0 + 4.0));
                fVar197 = auVar126._0_4_;
                local_ba0 = auVar365._0_4_;
                if (fVar197 < 0.0) {
                  local_ac0._0_4_ = fVar182;
                  local_ae0._0_16_ = ZEXT416((uint)fVar196);
                  local_920._0_4_ = fVar235;
                  local_940._0_4_ = fVar236 * 9.0;
                  local_960._0_4_ = fVar196 * -2.0;
                  fVar237 = sqrtf(fVar197);
                  fVar250 = (float)local_940._0_4_;
                  fVar198 = (float)local_960._0_4_;
                  fVar182 = (float)local_ac0._0_4_;
                  fVar240 = (float)local_920._0_4_;
                  fVar196 = (float)local_ae0._0_4_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar126,auVar126);
                  fVar237 = auVar185._0_4_;
                  fVar250 = fVar236 * 9.0;
                  fVar198 = fVar196 * -2.0;
                  fVar240 = fVar235;
                }
                auVar185 = ZEXT416((uint)((fVar182 + fVar198 * fVar236) * 0.5));
                auVar185 = vshufps_avx(auVar185,auVar185,0);
                auVar101 = ZEXT416((uint)(((fVar196 + fVar196) * (fVar240 + 2.0) +
                                          fVar196 * fVar196 * -3.0) * 0.5));
                auVar101 = vshufps_avx(auVar101,auVar101,0);
                auVar127 = ZEXT416((uint)(((fVar236 + fVar236) * (float)local_b00._0_4_ +
                                          fVar236 * fVar240) * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar128 = ZEXT416((uint)((fVar236 * (fVar196 + fVar196) - (float)local_aa0._0_4_) *
                                         0.5));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar382._0_4_ =
                     (float)local_a20._0_4_ * auVar128._0_4_ +
                     (float)local_a40._0_4_ * auVar127._0_4_ +
                     (float)local_a50._0_4_ * auVar185._0_4_ +
                     (float)local_a30._0_4_ * auVar101._0_4_;
                auVar382._4_4_ =
                     (float)local_a20._4_4_ * auVar128._4_4_ +
                     (float)local_a40._4_4_ * auVar127._4_4_ +
                     (float)local_a50._4_4_ * auVar185._4_4_ +
                     (float)local_a30._4_4_ * auVar101._4_4_;
                auVar382._8_4_ =
                     fStack_a18 * auVar128._8_4_ +
                     fStack_a38 * auVar127._8_4_ +
                     fStack_a48 * auVar185._8_4_ + fStack_a28 * auVar101._8_4_;
                auVar382._12_4_ =
                     fStack_a14 * auVar128._12_4_ +
                     fStack_a34 * auVar127._12_4_ +
                     fStack_a44 * auVar185._12_4_ + fStack_a24 * auVar101._12_4_;
                auVar128 = vpermilps_avx(ZEXT416((uint)(fVar235 + -1.0)),0);
                auVar15 = vpermilps_avx(local_a80._0_16_,0);
                auVar185 = vshufps_avx(ZEXT416((uint)(fVar250 + -5.0)),
                                       ZEXT416((uint)(fVar250 + -5.0)),0);
                auVar101 = ZEXT416((uint)(fVar236 * -3.0 + 2.0));
                auVar127 = vshufps_avx(auVar101,auVar101,0);
                auVar101 = vdpps_avx(auVar382,auVar382,0x7f);
                auVar134._0_4_ =
                     (float)local_a20._0_4_ * auVar127._0_4_ +
                     (float)local_a40._0_4_ * auVar185._0_4_ +
                     (float)local_a30._0_4_ * auVar15._0_4_ +
                     (float)local_a50._0_4_ * auVar128._0_4_;
                auVar134._4_4_ =
                     (float)local_a20._4_4_ * auVar127._4_4_ +
                     (float)local_a40._4_4_ * auVar185._4_4_ +
                     (float)local_a30._4_4_ * auVar15._4_4_ +
                     (float)local_a50._4_4_ * auVar128._4_4_;
                auVar134._8_4_ =
                     fStack_a18 * auVar127._8_4_ +
                     fStack_a38 * auVar185._8_4_ +
                     fStack_a28 * auVar15._8_4_ + fStack_a48 * auVar128._8_4_;
                auVar134._12_4_ =
                     fStack_a14 * auVar127._12_4_ +
                     fStack_a34 * auVar185._12_4_ +
                     fStack_a24 * auVar15._12_4_ + fStack_a44 * auVar128._12_4_;
                auVar185 = vblendps_avx(auVar101,_DAT_01feba10,0xe);
                auVar127 = vrsqrtss_avx(auVar185,auVar185);
                fVar235 = auVar127._0_4_;
                fVar182 = auVar101._0_4_;
                auVar127 = vdpps_avx(auVar382,auVar134,0x7f);
                auVar128 = vshufps_avx(auVar101,auVar101,0);
                auVar135._0_4_ = auVar134._0_4_ * auVar128._0_4_;
                auVar135._4_4_ = auVar134._4_4_ * auVar128._4_4_;
                auVar135._8_4_ = auVar134._8_4_ * auVar128._8_4_;
                auVar135._12_4_ = auVar134._12_4_ * auVar128._12_4_;
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar206._0_4_ = auVar382._0_4_ * auVar127._0_4_;
                auVar206._4_4_ = auVar382._4_4_ * auVar127._4_4_;
                auVar206._8_4_ = auVar382._8_4_ * auVar127._8_4_;
                auVar206._12_4_ = auVar382._12_4_ * auVar127._12_4_;
                auVar15 = vsubps_avx(auVar135,auVar206);
                auVar127 = vrcpss_avx(auVar185,auVar185);
                auVar185 = vmaxss_avx(ZEXT416((uint)local_9c0._0_4_),
                                      ZEXT416((uint)(local_ba0 * (float)local_780._0_4_)));
                auVar354 = ZEXT1664(auVar185);
                auVar127 = ZEXT416((uint)(auVar127._0_4_ * (2.0 - fVar182 * auVar127._0_4_)));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                uVar93 = CONCAT44(auVar382._4_4_,auVar382._0_4_);
                auVar226._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar226._8_4_ = -auVar382._8_4_;
                auVar226._12_4_ = -auVar382._12_4_;
                auVar128 = ZEXT416((uint)(fVar235 * 1.5 +
                                         fVar182 * -0.5 * fVar235 * fVar235 * fVar235));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar188._0_4_ = auVar128._0_4_ * auVar15._0_4_ * auVar127._0_4_;
                auVar188._4_4_ = auVar128._4_4_ * auVar15._4_4_ * auVar127._4_4_;
                auVar188._8_4_ = auVar128._8_4_ * auVar15._8_4_ * auVar127._8_4_;
                auVar188._12_4_ = auVar128._12_4_ * auVar15._12_4_ * auVar127._12_4_;
                auVar245._0_4_ = auVar382._0_4_ * auVar128._0_4_;
                auVar245._4_4_ = auVar382._4_4_ * auVar128._4_4_;
                auVar245._8_4_ = auVar382._8_4_ * auVar128._8_4_;
                auVar245._12_4_ = auVar382._12_4_ * auVar128._12_4_;
                local_b00._0_16_ = auVar382;
                local_a80._0_4_ = auVar185._0_4_;
                if (fVar182 < 0.0) {
                  local_aa0._0_16_ = auVar226;
                  local_ac0._0_16_ = auVar245;
                  local_ae0._0_16_ = auVar188;
                  fVar182 = sqrtf(fVar182);
                  auVar354 = ZEXT464((uint)local_a80._0_4_);
                  auVar188 = local_ae0._0_16_;
                  auVar226 = local_aa0._0_16_;
                  auVar245 = local_ac0._0_16_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar101,auVar101);
                  fVar182 = auVar185._0_4_;
                }
                auVar185 = vdpps_avx(_local_9e0,auVar245,0x7f);
                fVar182 = ((float)local_9c0._0_4_ / fVar182) * (fVar237 + 1.0) +
                          auVar354._0_4_ + fVar237 * (float)local_9c0._0_4_;
                auVar101 = vdpps_avx(auVar226,auVar245,0x7f);
                auVar127 = vdpps_avx(_local_9e0,auVar188,0x7f);
                auVar128 = vdpps_avx(_local_8f0,auVar245,0x7f);
                auVar15 = vdpps_avx(_local_9e0,auVar226,0x7f);
                fVar235 = auVar101._0_4_ + auVar127._0_4_;
                fVar196 = auVar185._0_4_;
                auVar106._0_4_ = fVar196 * fVar196;
                auVar106._4_4_ = auVar185._4_4_ * auVar185._4_4_;
                auVar106._8_4_ = auVar185._8_4_ * auVar185._8_4_;
                auVar106._12_4_ = auVar185._12_4_ * auVar185._12_4_;
                auVar127 = vsubps_avx(auVar126,auVar106);
                auVar101 = vdpps_avx(_local_9e0,_local_8f0,0x7f);
                fVar237 = auVar15._0_4_ - fVar196 * fVar235;
                fVar198 = auVar101._0_4_ - fVar196 * auVar128._0_4_;
                auVar101 = vrsqrtss_avx(auVar127,auVar127);
                fVar240 = auVar127._0_4_;
                fVar196 = auVar101._0_4_;
                fVar196 = fVar196 * 1.5 + fVar240 * -0.5 * fVar196 * fVar196 * fVar196;
                if (fVar240 < 0.0) {
                  local_aa0._0_4_ = fVar182;
                  local_ac0._0_16_ = ZEXT416((uint)fVar235);
                  local_ae0._0_16_ = auVar128;
                  local_920._0_4_ = fVar237;
                  local_940._0_4_ = fVar198;
                  local_960._0_4_ = fVar196;
                  fVar240 = sqrtf(fVar240);
                  auVar354 = ZEXT464((uint)local_a80._0_4_);
                  fVar196 = (float)local_960._0_4_;
                  fVar237 = (float)local_920._0_4_;
                  fVar198 = (float)local_940._0_4_;
                  auVar128 = local_ae0._0_16_;
                  fVar182 = (float)local_aa0._0_4_;
                  auVar101 = local_ac0._0_16_;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar127,auVar127);
                  fVar240 = auVar101._0_4_;
                  auVar101 = ZEXT416((uint)fVar235);
                }
                auVar386 = ZEXT1664(auVar185);
                auVar296 = ZEXT1664(auVar126);
                auVar98 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar97 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar235 = fVar237 * fVar196 - auVar97._0_4_;
                auVar207._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
                auVar207._8_4_ = auVar128._8_4_ ^ 0x80000000;
                auVar207._12_4_ = auVar128._12_4_ ^ 0x80000000;
                auVar227._0_4_ = -fVar235;
                auVar227._4_4_ = 0x80000000;
                auVar227._8_4_ = 0x80000000;
                auVar227._12_4_ = 0x80000000;
                auVar127 = vinsertps_avx(ZEXT416((uint)(fVar198 * fVar196)),auVar207,0x10);
                auVar15 = vmovsldup_avx(ZEXT416((uint)(auVar101._0_4_ * fVar198 * fVar196 -
                                                      auVar128._0_4_ * fVar235)));
                auVar127 = vdivps_avx(auVar127,auVar15);
                auVar98 = ZEXT416((uint)(fVar240 - auVar98._0_4_));
                auVar128 = vinsertps_avx(auVar185,auVar98,0x10);
                auVar189._0_4_ = auVar128._0_4_ * auVar127._0_4_;
                auVar189._4_4_ = auVar128._4_4_ * auVar127._4_4_;
                auVar189._8_4_ = auVar128._8_4_ * auVar127._8_4_;
                auVar189._12_4_ = auVar128._12_4_ * auVar127._12_4_;
                auVar101 = vinsertps_avx(auVar227,auVar101,0x1c);
                auVar101 = vdivps_avx(auVar101,auVar15);
                auVar171._0_4_ = auVar128._0_4_ * auVar101._0_4_;
                auVar171._4_4_ = auVar128._4_4_ * auVar101._4_4_;
                auVar171._8_4_ = auVar128._8_4_ * auVar101._8_4_;
                auVar171._12_4_ = auVar128._12_4_ * auVar101._12_4_;
                auVar101 = vhaddps_avx(auVar189,auVar189);
                auVar127 = vhaddps_avx(auVar171,auVar171);
                fVar236 = fVar236 - auVar101._0_4_;
                local_ba0 = local_ba0 - auVar127._0_4_;
                auVar365 = ZEXT464((uint)local_ba0);
                auVar208._8_4_ = 0x7fffffff;
                auVar208._0_8_ = 0x7fffffff7fffffff;
                auVar208._12_4_ = 0x7fffffff;
                auVar249 = ZEXT1664(auVar208);
                auVar101 = vandps_avx(auVar185,auVar208);
                if (fVar182 <= auVar101._0_4_) {
LAB_00f4ca01:
                  bVar68 = false;
                }
                else {
                  auVar101 = vandps_avx(auVar98,auVar208);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar354._0_4_ + fVar182 <=
                      auVar101._0_4_) goto LAB_00f4ca01;
                  local_ba0 = local_ba0 + (float)local_8c0._0_4_;
                  auVar365 = ZEXT464((uint)local_ba0);
                  bVar68 = true;
                  if ((((fVar220 <= local_ba0) &&
                       (fVar182 = *(float *)(ray + k * 4 + 0x80), local_ba0 <= fVar182)) &&
                      (0.0 <= fVar236)) && (fVar236 <= 1.0)) {
                    auVar101 = vrsqrtss_avx(auVar126,auVar126);
                    fVar235 = auVar101._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar101 = ZEXT416((uint)(fVar235 * 1.5 +
                                               fVar197 * -0.5 * fVar235 * fVar235 * fVar235));
                      auVar101 = vshufps_avx(auVar101,auVar101,0);
                      auVar136._0_4_ = auVar101._0_4_ * (float)local_9e0._0_4_;
                      auVar136._4_4_ = auVar101._4_4_ * (float)local_9e0._4_4_;
                      auVar136._8_4_ = auVar101._8_4_ * fStack_9d8;
                      auVar136._12_4_ = auVar101._12_4_ * fStack_9d4;
                      auVar107._0_4_ = local_b00._0_4_ + auVar97._0_4_ * auVar136._0_4_;
                      auVar107._4_4_ = local_b00._4_4_ + auVar97._4_4_ * auVar136._4_4_;
                      auVar107._8_4_ = local_b00._8_4_ + auVar97._8_4_ * auVar136._8_4_;
                      auVar107._12_4_ = local_b00._12_4_ + auVar97._12_4_ * auVar136._12_4_;
                      auVar101 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar127 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar137._0_4_ = auVar127._0_4_ * auVar136._0_4_;
                      auVar137._4_4_ = auVar127._4_4_ * auVar136._4_4_;
                      auVar137._8_4_ = auVar127._8_4_ * auVar136._8_4_;
                      auVar137._12_4_ = auVar127._12_4_ * auVar136._12_4_;
                      auVar172._0_4_ = local_b00._0_4_ * auVar101._0_4_;
                      auVar172._4_4_ = local_b00._4_4_ * auVar101._4_4_;
                      auVar172._8_4_ = local_b00._8_4_ * auVar101._8_4_;
                      auVar172._12_4_ = local_b00._12_4_ * auVar101._12_4_;
                      auVar128 = vsubps_avx(auVar172,auVar137);
                      auVar101 = vshufps_avx(auVar128,auVar128,0xc9);
                      auVar127 = vshufps_avx(auVar107,auVar107,0xc9);
                      auVar173._0_4_ = auVar127._0_4_ * auVar101._0_4_;
                      auVar173._4_4_ = auVar127._4_4_ * auVar101._4_4_;
                      auVar173._8_4_ = auVar127._8_4_ * auVar101._8_4_;
                      auVar173._12_4_ = auVar127._12_4_ * auVar101._12_4_;
                      auVar101 = vshufps_avx(auVar128,auVar128,0xd2);
                      auVar108._0_4_ = auVar107._0_4_ * auVar101._0_4_;
                      auVar108._4_4_ = auVar107._4_4_ * auVar101._4_4_;
                      auVar108._8_4_ = auVar107._8_4_ * auVar101._8_4_;
                      auVar108._12_4_ = auVar107._12_4_ * auVar101._12_4_;
                      auVar101 = vsubps_avx(auVar173,auVar108);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_ba0;
                        uVar1 = vextractps_avx(auVar101,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar101,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar101._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar236;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar88;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_710 = vshufps_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),0);
                        local_740 = (RTCHitN  [16])vshufps_avx(auVar101,auVar101,0x55);
                        auVar127 = vshufps_avx(auVar101,auVar101,0xaa);
                        local_720 = vshufps_avx(auVar101,auVar101,0);
                        auStack_730 = auVar127;
                        local_700 = ZEXT816(0) << 0x20;
                        local_6f0 = local_760._0_8_;
                        uStack_6e8 = local_760._8_8_;
                        local_6e0 = local_750._0_8_;
                        uStack_6d8 = local_750._8_8_;
                        uVar3 = context->user->instID[0];
                        _local_6d0 = CONCAT44(uVar3,uVar3);
                        _uStack_6c8 = CONCAT44(uVar3,uVar3);
                        uVar3 = context->user->instPrimID[0];
                        _uStack_6c0 = CONCAT44(uVar3,uVar3);
                        _uStack_6b8 = CONCAT44(uVar3,uVar3);
                        *(float *)(ray + k * 4 + 0x80) = local_ba0;
                        local_b20 = *local_988;
                        uStack_b18 = local_988[1];
                        local_a10.valid = (int *)&local_b20;
                        local_a10.geometryUserPtr = pGVar4->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = local_740;
                        local_a10.N = 4;
                        local_a10.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar296 = ZEXT1664(auVar126);
                          auVar354 = ZEXT1664(auVar354._0_16_);
                          auVar386 = ZEXT1664(auVar185);
                          (*pGVar4->intersectionFilterN)(&local_a10);
                        }
                        auVar84._8_8_ = uStack_b18;
                        auVar84._0_8_ = local_b20;
                        if (auVar84 == (undefined1  [16])0x0) {
                          auVar126 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar126 = auVar126 ^ _DAT_01febe20;
                          auVar249 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var5 = context->args->filter;
                          auVar249 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar296 = ZEXT1664(auVar296._0_16_);
                            auVar354 = ZEXT1664(auVar354._0_16_);
                            auVar386 = ZEXT1664(auVar386._0_16_);
                            (*p_Var5)(&local_a10);
                            auVar249 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar85._8_8_ = uStack_b18;
                          auVar85._0_8_ = local_b20;
                          auVar185 = vpcmpeqd_avx(auVar85,_DAT_01feba10);
                          auVar101 = vpcmpeqd_avx(auVar127,auVar127);
                          auVar126 = auVar185 ^ auVar101;
                          if (auVar85 != (undefined1  [16])0x0) {
                            auVar185 = auVar185 ^ auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])local_a10.hit);
                            *(undefined1 (*) [16])(local_a10.ray + 0xc0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x10));
                            *(undefined1 (*) [16])(local_a10.ray + 0xd0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x20));
                            *(undefined1 (*) [16])(local_a10.ray + 0xe0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x30));
                            *(undefined1 (*) [16])(local_a10.ray + 0xf0) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x40));
                            *(undefined1 (*) [16])(local_a10.ray + 0x100) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x50));
                            *(undefined1 (*) [16])(local_a10.ray + 0x110) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x60));
                            *(undefined1 (*) [16])(local_a10.ray + 0x120) = auVar101;
                            auVar101 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x70));
                            *(undefined1 (*) [16])(local_a10.ray + 0x130) = auVar101;
                            auVar185 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                                (local_a10.hit + 0x80));
                            *(undefined1 (*) [16])(local_a10.ray + 0x140) = auVar185;
                          }
                        }
                        auVar365 = ZEXT464((uint)local_ba0);
                        auVar138._8_8_ = 0x100000001;
                        auVar138._0_8_ = 0x100000001;
                        if ((auVar138 & auVar126) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar182;
                        }
                      }
                    }
                  }
                }
                auVar110 = local_620;
                auVar358 = ZEXT464((uint)fVar236);
                bVar94 = lVar92 != 0;
                lVar92 = lVar92 + -1;
              } while ((!bVar68) && (bVar94));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar119._4_4_ = uVar1;
              auVar119._0_4_ = uVar1;
              auVar119._8_4_ = uVar1;
              auVar119._12_4_ = uVar1;
              auVar119._16_4_ = uVar1;
              auVar119._20_4_ = uVar1;
              auVar119._24_4_ = uVar1;
              auVar119._28_4_ = uVar1;
              auVar111 = vcmpps_avx(_local_840,auVar119,2);
              local_620 = vandps_avx(auVar111,local_620);
              auVar110 = auVar110 & auVar111;
              uVar93 = local_640._0_8_;
            } while ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar110 >> 0x7f,0) != '\0') ||
                       (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar110 >> 0xbf,0) != '\0') ||
                     (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar110[0x1f] < '\0');
          }
          auVar249 = ZEXT1664(local_a60);
          auVar110 = vandps_avx(local_580,local_560);
          auVar111 = vandps_avx(_local_8a0,_local_880);
          auVar181._0_4_ = (float)local_980._0_4_ + local_320._0_4_;
          auVar181._4_4_ = (float)local_980._4_4_ + local_320._4_4_;
          auVar181._8_4_ = fStack_978 + local_320._8_4_;
          auVar181._12_4_ = fStack_974 + local_320._12_4_;
          auVar181._16_4_ = fStack_970 + local_320._16_4_;
          auVar181._20_4_ = fStack_96c + local_320._20_4_;
          auVar181._24_4_ = fStack_968 + local_320._24_4_;
          auVar181._28_4_ = fStack_964 + local_320._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar213._4_4_ = uVar1;
          auVar213._0_4_ = uVar1;
          auVar213._8_4_ = uVar1;
          auVar213._12_4_ = uVar1;
          auVar213._16_4_ = uVar1;
          auVar213._20_4_ = uVar1;
          auVar213._24_4_ = uVar1;
          auVar213._28_4_ = uVar1;
          auVar210 = vcmpps_avx(auVar181,auVar213,2);
          auVar110 = vandps_avx(auVar210,auVar110);
          auVar233._0_4_ = (float)local_980._0_4_ + local_2e0._0_4_;
          auVar233._4_4_ = (float)local_980._4_4_ + local_2e0._4_4_;
          auVar233._8_4_ = fStack_978 + local_2e0._8_4_;
          auVar233._12_4_ = fStack_974 + local_2e0._12_4_;
          auVar233._16_4_ = fStack_970 + local_2e0._16_4_;
          auVar233._20_4_ = fStack_96c + local_2e0._20_4_;
          auVar233._24_4_ = fStack_968 + local_2e0._24_4_;
          auVar233._28_4_ = fStack_964 + local_2e0._28_4_;
          auVar210 = vcmpps_avx(auVar233,auVar213,2);
          auVar111 = vandps_avx(auVar210,auVar111);
          auVar111 = vorps_avx(auVar110,auVar111);
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar111 >> 0x7f,0) != '\0') ||
                (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0xbf,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar111[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar111;
            auVar110 = vblendvps_avx(_local_2e0,_local_320,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar110;
            *(long *)(afStack_140 + uVar91 * 0x18) = local_a60._0_8_;
            auStack_138[uVar91 * 0x18] = (int)uVar93 + 1;
            uVar91 = (ulong)((int)uVar91 + 1);
          }
          goto LAB_00f4ab64;
        }
        auVar210._8_4_ = 0x3f800000;
        auVar210._0_8_ = &DAT_3f8000003f800000;
        auVar210._12_4_ = 0x3f800000;
        auVar210._16_4_ = 0x3f800000;
        auVar210._20_4_ = 0x3f800000;
        auVar210._24_4_ = 0x3f800000;
        auVar210._28_4_ = 0x3f800000;
      }
      auVar249 = ZEXT1664(local_a60);
      fVar182 = fStack_964;
      fVar235 = fStack_968;
      fVar196 = fStack_96c;
      fVar236 = fStack_970;
      fVar197 = fStack_974;
      fVar237 = fStack_978;
      fVar198 = (float)local_980._4_4_;
      fVar240 = (float)local_980._0_4_;
    }
    do {
      if ((int)uVar91 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar109._4_4_ = uVar1;
        auVar109._0_4_ = uVar1;
        auVar109._8_4_ = uVar1;
        auVar109._12_4_ = uVar1;
        auVar126 = vcmpps_avx(local_4f0,auVar109,2);
        uVar88 = vmovmskps_avx(auVar126);
        uVar88 = (uint)local_8a8 & uVar88;
        if (uVar88 == 0) {
          return;
        }
        goto LAB_00f49ff5;
      }
      uVar89 = (ulong)((int)uVar91 - 1);
      lVar92 = uVar89 * 0x60;
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar92);
      auVar115._0_4_ = fVar240 + auVar110._0_4_;
      auVar115._4_4_ = fVar198 + auVar110._4_4_;
      auVar115._8_4_ = fVar237 + auVar110._8_4_;
      auVar115._12_4_ = fVar197 + auVar110._12_4_;
      auVar115._16_4_ = fVar236 + auVar110._16_4_;
      auVar115._20_4_ = fVar196 + auVar110._20_4_;
      auVar115._24_4_ = fVar235 + auVar110._24_4_;
      auVar115._28_4_ = fVar182 + auVar110._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar195._4_4_ = uVar1;
      auVar195._0_4_ = uVar1;
      auVar195._8_4_ = uVar1;
      auVar195._12_4_ = uVar1;
      auVar195._16_4_ = uVar1;
      auVar195._20_4_ = uVar1;
      auVar195._24_4_ = uVar1;
      auVar195._28_4_ = uVar1;
      auVar16 = vcmpps_avx(auVar115,auVar195,2);
      auVar111 = vandps_avx(auVar16,*(undefined1 (*) [32])(auStack_180 + lVar92));
      _local_740 = auVar111;
      auVar16 = *(undefined1 (*) [32])(auStack_180 + lVar92) & auVar16;
      bVar74 = (auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar75 = (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar73 = (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar72 = SUB321(auVar16 >> 0x7f,0) == '\0';
      bVar71 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar70 = SUB321(auVar16 >> 0xbf,0) == '\0';
      bVar94 = (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar68 = -1 < auVar16[0x1f];
      if (((((((!bVar74 || !bVar75) || !bVar73) || !bVar72) || !bVar71) || !bVar70) || !bVar94) ||
          !bVar68) {
        auVar177._8_4_ = 0x7f800000;
        auVar177._0_8_ = 0x7f8000007f800000;
        auVar177._12_4_ = 0x7f800000;
        auVar177._16_4_ = 0x7f800000;
        auVar177._20_4_ = 0x7f800000;
        auVar177._24_4_ = 0x7f800000;
        auVar177._28_4_ = 0x7f800000;
        auVar110 = vblendvps_avx(auVar177,auVar110,auVar111);
        auVar16 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar16 = vminps_avx(auVar110,auVar16);
        auVar17 = vshufpd_avx(auVar16,auVar16,5);
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar17 = vperm2f128_avx(auVar16,auVar16,1);
        auVar16 = vminps_avx(auVar16,auVar17);
        auVar110 = vcmpps_avx(auVar110,auVar16,0);
        auVar16 = auVar111 & auVar110;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0x7f,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0xbf,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar16[0x1f] < '\0') {
          auVar111 = vandps_avx(auVar110,auVar111);
        }
        fVar250 = afStack_140[uVar89 * 0x18 + 1];
        uVar93 = (ulong)auStack_138[uVar89 * 0x18];
        uVar90 = vmovmskps_avx(auVar111);
        uVar3 = 0;
        if (uVar90 != 0) {
          for (; (uVar90 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        fVar253 = afStack_140[uVar89 * 0x18];
        *(undefined4 *)(local_740 + (ulong)uVar3 * 4) = 0;
        if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_740 >> 0x7f,0) != '\0') ||
              (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_740 >> 0xbf,0) != '\0') ||
            (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_740[0x1f] < '\0') {
          uVar89 = uVar91;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar92) = _local_740;
        auVar126 = vshufps_avx(ZEXT416((uint)(fVar250 - fVar253)),ZEXT416((uint)(fVar250 - fVar253))
                               ,0);
        local_320._4_4_ = fVar253 + auVar126._4_4_ * 0.14285715;
        local_320._0_4_ = fVar253 + auVar126._0_4_ * 0.0;
        fStack_318 = fVar253 + auVar126._8_4_ * 0.2857143;
        fStack_314 = fVar253 + auVar126._12_4_ * 0.42857146;
        fStack_310 = fVar253 + auVar126._0_4_ * 0.5714286;
        fStack_30c = fVar253 + auVar126._4_4_ * 0.71428573;
        fStack_308 = fVar253 + auVar126._8_4_ * 0.8571429;
        fStack_304 = fVar253 + auVar126._12_4_;
        auVar249 = ZEXT864(*(ulong *)(local_320 + (ulong)uVar3 * 4));
      }
      uVar91 = uVar89;
    } while (((((((bVar74 && bVar75) && bVar73) && bVar72) && bVar71) && bVar70) && bVar94) &&
             bVar68);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }